

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [12];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar64;
  int iVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  ulong uVar80;
  byte bVar81;
  byte bVar82;
  ulong uVar83;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  uint uVar84;
  long lVar85;
  bool bVar86;
  ulong uVar87;
  uint uVar88;
  uint uVar145;
  uint uVar146;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  uint uVar147;
  uint uVar151;
  undefined1 auVar138 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [32];
  float pp;
  float fVar152;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined4 uVar153;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar204;
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar226 [32];
  float fVar233;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  float t;
  float fVar241;
  float fVar246;
  undefined1 auVar242 [16];
  float fVar244;
  float fVar245;
  undefined1 auVar243 [64];
  float s;
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [64];
  float s_1;
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_920;
  undefined8 local_900;
  undefined8 uStack_8f8;
  ulong local_8f0;
  uint local_8e4;
  uint local_8e0;
  undefined4 local_8dc;
  float local_8d8;
  float local_8d4;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  Primitive *local_840;
  ulong local_838;
  ulong local_830;
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  uint local_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint uStack_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar140 [32];
  undefined1 auVar143 [32];
  
  PVar2 = prim[1];
  uVar83 = (ulong)(byte)PVar2;
  fVar205 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar96 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar95 = vsubps_avx(auVar91,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  fVar204 = fVar205 * auVar95._0_4_;
  fVar152 = fVar205 * auVar96._0_4_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar92);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar106 = vpmovsxbd_avx2(auVar89);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar99);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar112 = vpmovsxbd_avx2(auVar93);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar108 = vcvtdq2ps_avx(auVar112);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar83 + 6);
  auVar104 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar87 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar242._8_8_ = 0;
  auVar242._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar109 = vpmovsxbd_avx2(auVar242);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar87 + uVar83 + 6);
  auVar110 = vpmovsxbd_avx2(auVar94);
  auVar110 = vcvtdq2ps_avx(auVar110);
  uVar80 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar102 = vpmovsxbd_avx2(auVar1);
  auVar111 = vcvtdq2ps_avx(auVar102);
  auVar122._4_4_ = fVar152;
  auVar122._0_4_ = fVar152;
  auVar122._8_4_ = fVar152;
  auVar122._12_4_ = fVar152;
  auVar122._16_4_ = fVar152;
  auVar122._20_4_ = fVar152;
  auVar122._24_4_ = fVar152;
  auVar122._28_4_ = fVar152;
  auVar124._8_4_ = 1;
  auVar124._0_8_ = 0x100000001;
  auVar124._12_4_ = 1;
  auVar124._16_4_ = 1;
  auVar124._20_4_ = 1;
  auVar124._24_4_ = 1;
  auVar124._28_4_ = 1;
  auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar114 = ZEXT1632(CONCAT412(fVar205 * auVar96._12_4_,
                                CONCAT48(fVar205 * auVar96._8_4_,
                                         CONCAT44(fVar205 * auVar96._4_4_,fVar152))));
  auVar113 = vpermps_avx2(auVar124,auVar114);
  auVar101 = vpermps_avx512vl(auVar100,auVar114);
  fVar152 = auVar101._0_4_;
  fVar227 = auVar101._4_4_;
  auVar114._4_4_ = fVar227 * auVar106._4_4_;
  auVar114._0_4_ = fVar152 * auVar106._0_4_;
  fVar228 = auVar101._8_4_;
  auVar114._8_4_ = fVar228 * auVar106._8_4_;
  fVar229 = auVar101._12_4_;
  auVar114._12_4_ = fVar229 * auVar106._12_4_;
  fVar232 = auVar101._16_4_;
  auVar114._16_4_ = fVar232 * auVar106._16_4_;
  fVar230 = auVar101._20_4_;
  auVar114._20_4_ = fVar230 * auVar106._20_4_;
  fVar231 = auVar101._24_4_;
  auVar114._24_4_ = fVar231 * auVar106._24_4_;
  auVar114._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar104._4_4_ * fVar227;
  auVar112._0_4_ = auVar104._0_4_ * fVar152;
  auVar112._8_4_ = auVar104._8_4_ * fVar228;
  auVar112._12_4_ = auVar104._12_4_ * fVar229;
  auVar112._16_4_ = auVar104._16_4_ * fVar232;
  auVar112._20_4_ = auVar104._20_4_ * fVar230;
  auVar112._24_4_ = auVar104._24_4_ * fVar231;
  auVar112._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar111._4_4_ * fVar227;
  auVar102._0_4_ = auVar111._0_4_ * fVar152;
  auVar102._8_4_ = auVar111._8_4_ * fVar228;
  auVar102._12_4_ = auVar111._12_4_ * fVar229;
  auVar102._16_4_ = auVar111._16_4_ * fVar232;
  auVar102._20_4_ = auVar111._20_4_ * fVar230;
  auVar102._24_4_ = auVar111._24_4_ * fVar231;
  auVar102._28_4_ = auVar101._28_4_;
  auVar91 = vfmadd231ps_fma(auVar114,auVar113,auVar103);
  auVar92 = vfmadd231ps_fma(auVar112,auVar113,auVar108);
  auVar89 = vfmadd231ps_fma(auVar102,auVar110,auVar113);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar122,auVar105);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar122,auVar107);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar109,auVar122);
  auVar123._4_4_ = fVar204;
  auVar123._0_4_ = fVar204;
  auVar123._8_4_ = fVar204;
  auVar123._12_4_ = fVar204;
  auVar123._16_4_ = fVar204;
  auVar123._20_4_ = fVar204;
  auVar123._24_4_ = fVar204;
  auVar123._28_4_ = fVar204;
  auVar102 = ZEXT1632(CONCAT412(fVar205 * auVar95._12_4_,
                                CONCAT48(fVar205 * auVar95._8_4_,
                                         CONCAT44(fVar205 * auVar95._4_4_,fVar204))));
  auVar112 = vpermps_avx2(auVar124,auVar102);
  auVar102 = vpermps_avx512vl(auVar100,auVar102);
  fVar205 = auVar102._0_4_;
  fVar152 = auVar102._4_4_;
  auVar113._4_4_ = fVar152 * auVar106._4_4_;
  auVar113._0_4_ = fVar205 * auVar106._0_4_;
  fVar227 = auVar102._8_4_;
  auVar113._8_4_ = fVar227 * auVar106._8_4_;
  fVar228 = auVar102._12_4_;
  auVar113._12_4_ = fVar228 * auVar106._12_4_;
  fVar229 = auVar102._16_4_;
  auVar113._16_4_ = fVar229 * auVar106._16_4_;
  fVar232 = auVar102._20_4_;
  auVar113._20_4_ = fVar232 * auVar106._20_4_;
  fVar230 = auVar102._24_4_;
  auVar113._24_4_ = fVar230 * auVar106._24_4_;
  auVar113._28_4_ = 1;
  auVar100._4_4_ = auVar104._4_4_ * fVar152;
  auVar100._0_4_ = auVar104._0_4_ * fVar205;
  auVar100._8_4_ = auVar104._8_4_ * fVar227;
  auVar100._12_4_ = auVar104._12_4_ * fVar228;
  auVar100._16_4_ = auVar104._16_4_ * fVar229;
  auVar100._20_4_ = auVar104._20_4_ * fVar232;
  auVar100._24_4_ = auVar104._24_4_ * fVar230;
  auVar100._28_4_ = auVar106._28_4_;
  auVar104._4_4_ = auVar111._4_4_ * fVar152;
  auVar104._0_4_ = auVar111._0_4_ * fVar205;
  auVar104._8_4_ = auVar111._8_4_ * fVar227;
  auVar104._12_4_ = auVar111._12_4_ * fVar228;
  auVar104._16_4_ = auVar111._16_4_ * fVar229;
  auVar104._20_4_ = auVar111._20_4_ * fVar232;
  auVar104._24_4_ = auVar111._24_4_ * fVar230;
  auVar104._28_4_ = auVar102._28_4_;
  auVar99 = vfmadd231ps_fma(auVar113,auVar112,auVar103);
  auVar93 = vfmadd231ps_fma(auVar100,auVar112,auVar108);
  auVar90 = vfmadd231ps_fma(auVar104,auVar112,auVar110);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar123,auVar105);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar123,auVar107);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar123,auVar109);
  auVar105 = vandps_avx(ZEXT1632(auVar91),auVar119);
  auVar121._8_4_ = 0x219392ef;
  auVar121._0_8_ = 0x219392ef219392ef;
  auVar121._12_4_ = 0x219392ef;
  auVar121._16_4_ = 0x219392ef;
  auVar121._20_4_ = 0x219392ef;
  auVar121._24_4_ = 0x219392ef;
  auVar121._28_4_ = 0x219392ef;
  uVar87 = vcmpps_avx512vl(auVar105,auVar121,1);
  bVar6 = (bool)((byte)uVar87 & 1);
  auVar101._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar91._0_4_;
  bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar91._4_4_;
  bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar91._8_4_;
  bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar91._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar92),auVar119);
  uVar87 = vcmpps_avx512vl(auVar105,auVar121,1);
  bVar6 = (bool)((byte)uVar87 & 1);
  auVar115._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar92._0_4_;
  bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar92._4_4_;
  bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar92._8_4_;
  bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar92._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar89),auVar119);
  uVar87 = vcmpps_avx512vl(auVar105,auVar121,1);
  bVar6 = (bool)((byte)uVar87 & 1);
  auVar105._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._0_4_;
  bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._4_4_;
  bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._8_4_;
  bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar101);
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = &DAT_3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  auVar91 = vfnmadd213ps_fma(auVar101,auVar103,auVar120);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar115);
  auVar92 = vfnmadd213ps_fma(auVar115,auVar103,auVar120);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar105);
  auVar89 = vfnmadd213ps_fma(auVar105,auVar103,auVar120);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar103,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar99));
  auVar109._4_4_ = auVar91._4_4_ * auVar105._4_4_;
  auVar109._0_4_ = auVar91._0_4_ * auVar105._0_4_;
  auVar109._8_4_ = auVar91._8_4_ * auVar105._8_4_;
  auVar109._12_4_ = auVar91._12_4_ * auVar105._12_4_;
  auVar109._16_4_ = auVar105._16_4_ * 0.0;
  auVar109._20_4_ = auVar105._20_4_ * 0.0;
  auVar109._24_4_ = auVar105._24_4_ * 0.0;
  auVar109._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar99));
  auVar104 = vpbroadcastd_avx512vl();
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar118._0_4_ = auVar91._0_4_ * auVar105._0_4_;
  auVar118._4_4_ = auVar91._4_4_ * auVar105._4_4_;
  auVar118._8_4_ = auVar91._8_4_ * auVar105._8_4_;
  auVar118._12_4_ = auVar91._12_4_ * auVar105._12_4_;
  auVar118._16_4_ = auVar105._16_4_ * 0.0;
  auVar118._20_4_ = auVar105._20_4_ * 0.0;
  auVar118._24_4_ = auVar105._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar83 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar93));
  auVar110._4_4_ = auVar92._4_4_ * auVar105._4_4_;
  auVar110._0_4_ = auVar92._0_4_ * auVar105._0_4_;
  auVar110._8_4_ = auVar92._8_4_ * auVar105._8_4_;
  auVar110._12_4_ = auVar92._12_4_ * auVar105._12_4_;
  auVar110._16_4_ = auVar105._16_4_ * 0.0;
  auVar110._20_4_ = auVar105._20_4_ * 0.0;
  auVar110._24_4_ = auVar105._24_4_ * 0.0;
  auVar110._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar93));
  auVar117._0_4_ = auVar92._0_4_ * auVar105._0_4_;
  auVar117._4_4_ = auVar92._4_4_ * auVar105._4_4_;
  auVar117._8_4_ = auVar92._8_4_ * auVar105._8_4_;
  auVar117._12_4_ = auVar92._12_4_ * auVar105._12_4_;
  auVar117._16_4_ = auVar105._16_4_ * 0.0;
  auVar117._20_4_ = auVar105._20_4_ * 0.0;
  auVar117._24_4_ = auVar105._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + uVar83 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar90));
  auVar111._4_4_ = auVar105._4_4_ * auVar89._4_4_;
  auVar111._0_4_ = auVar105._0_4_ * auVar89._0_4_;
  auVar111._8_4_ = auVar105._8_4_ * auVar89._8_4_;
  auVar111._12_4_ = auVar105._12_4_ * auVar89._12_4_;
  auVar111._16_4_ = auVar105._16_4_ * 0.0;
  auVar111._20_4_ = auVar105._20_4_ * 0.0;
  auVar111._24_4_ = auVar105._24_4_ * 0.0;
  auVar111._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar90));
  auVar116._0_4_ = auVar89._0_4_ * auVar105._0_4_;
  auVar116._4_4_ = auVar89._4_4_ * auVar105._4_4_;
  auVar116._8_4_ = auVar89._8_4_ * auVar105._8_4_;
  auVar116._12_4_ = auVar89._12_4_ * auVar105._12_4_;
  auVar116._16_4_ = auVar105._16_4_ * 0.0;
  auVar116._20_4_ = auVar105._20_4_ * 0.0;
  auVar116._24_4_ = auVar105._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar109,auVar118);
  auVar103 = vpminsd_avx2(auVar110,auVar117);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar111,auVar116);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar106._4_4_ = uVar153;
  auVar106._0_4_ = uVar153;
  auVar106._8_4_ = uVar153;
  auVar106._12_4_ = uVar153;
  auVar106._16_4_ = uVar153;
  auVar106._20_4_ = uVar153;
  auVar106._24_4_ = uVar153;
  auVar106._28_4_ = uVar153;
  auVar103 = vmaxps_avx512vl(auVar103,auVar106);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar105,auVar103);
  auVar105 = vpmaxsd_avx2(auVar109,auVar118);
  auVar103 = vpmaxsd_avx2(auVar110,auVar117);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar111,auVar116);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar107._4_4_ = uVar153;
  auVar107._0_4_ = uVar153;
  auVar107._8_4_ = uVar153;
  auVar107._12_4_ = uVar153;
  auVar107._16_4_ = uVar153;
  auVar107._20_4_ = uVar153;
  auVar107._24_4_ = uVar153;
  auVar107._28_4_ = uVar153;
  auVar103 = vminps_avx512vl(auVar103,auVar107);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar108._8_4_ = 0x3f800003;
  auVar108._0_8_ = 0x3f8000033f800003;
  auVar108._12_4_ = 0x3f800003;
  auVar108._16_4_ = 0x3f800003;
  auVar108._20_4_ = 0x3f800003;
  auVar108._24_4_ = 0x3f800003;
  auVar108._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar108);
  uVar14 = vpcmpgtd_avx512vl(auVar104,_DAT_0205a920);
  uVar13 = vcmpps_avx512vl(local_400,auVar105,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return;
  }
  local_828 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_610 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_840 = prim;
LAB_01da9dc5:
  lVar85 = 0;
  for (uVar87 = local_828; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    lVar85 = lVar85 + 1;
  }
  uVar84 = *(uint *)(prim + 2);
  local_8f0 = (ulong)*(uint *)(prim + lVar85 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar84].ptr;
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8f0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar85 = *(long *)&pGVar4[1].time_range.upper;
  auVar91 = *(undefined1 (*) [16])(lVar85 + (long)p_Var5 * uVar87);
  auVar92 = *(undefined1 (*) [16])(lVar85 + (uVar87 + 1) * (long)p_Var5);
  local_828 = local_828 - 1 & local_828;
  if (local_828 != 0) {
    uVar83 = local_828 - 1 & local_828;
    for (uVar80 = local_828; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar99 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar256 = ZEXT3264(local_7e0);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar257 = ZEXT3264(local_800);
  auVar89 = vunpcklps_avx512vl(local_7e0._0_16_,local_800._0_16_);
  local_820 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar255 = ZEXT3264(local_820);
  auVar242 = local_820._0_16_;
  local_7b0 = vinsertps_avx512f(auVar89,auVar242,0x28);
  auVar243 = ZEXT1664(local_7b0);
  auVar95._0_4_ = auVar91._0_4_ + auVar92._0_4_;
  auVar95._4_4_ = auVar91._4_4_ + auVar92._4_4_;
  auVar95._8_4_ = auVar91._8_4_ + auVar92._8_4_;
  auVar95._12_4_ = auVar91._12_4_ + auVar92._12_4_;
  auVar96._8_4_ = 0x3f000000;
  auVar96._0_8_ = 0x3f0000003f000000;
  auVar96._12_4_ = 0x3f000000;
  auVar89 = vmulps_avx512vl(auVar95,auVar96);
  auVar89 = vsubps_avx(auVar89,auVar99);
  auVar89 = vdpps_avx(auVar89,local_7b0,0x7f);
  fVar205 = *(float *)(ray + k * 4 + 0x30);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  auVar250 = ZEXT1664(local_7c0);
  auVar97._4_12_ = ZEXT812(0) << 0x20;
  auVar97._0_4_ = local_7c0._0_4_;
  auVar90 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar97);
  auVar93 = vfnmadd213ss_fma(auVar90,local_7c0,ZEXT416(0x40000000));
  local_3e0 = auVar89._0_4_ * auVar90._0_4_ * auVar93._0_4_;
  auVar98._4_4_ = local_3e0;
  auVar98._0_4_ = local_3e0;
  auVar98._8_4_ = local_3e0;
  auVar98._12_4_ = local_3e0;
  fStack_690 = local_3e0;
  _local_6a0 = auVar98;
  fStack_68c = local_3e0;
  fStack_688 = local_3e0;
  fStack_684 = local_3e0;
  auVar89 = vfmadd231ps_fma(auVar99,local_7b0,auVar98);
  auVar89 = vblendps_avx(auVar89,ZEXT816(0) << 0x40,8);
  auVar91 = vsubps_avx(auVar91,auVar89);
  auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + (uVar87 + 2) * (long)p_Var5),auVar89);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar240 = ZEXT1664(auVar92);
  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + (uVar87 + 3) * (long)p_Var5),auVar89);
  auVar216 = ZEXT1664(auVar89);
  local_480 = auVar91._0_4_;
  uStack_47c = local_480;
  uStack_478 = local_480;
  uStack_474 = local_480;
  uStack_470 = local_480;
  uStack_46c = local_480;
  uStack_468 = local_480;
  uStack_464 = local_480;
  auVar129._8_4_ = 1;
  auVar129._0_8_ = 0x100000001;
  auVar129._12_4_ = 1;
  auVar129._16_4_ = 1;
  auVar129._20_4_ = 1;
  auVar129._24_4_ = 1;
  auVar129._28_4_ = 1;
  local_740 = ZEXT1632(auVar91);
  local_1e0 = vpermps_avx2(auVar129,local_740);
  auVar130._8_4_ = 2;
  auVar130._0_8_ = 0x200000002;
  auVar130._12_4_ = 2;
  auVar130._16_4_ = 2;
  auVar130._20_4_ = 2;
  auVar130._24_4_ = 2;
  auVar130._28_4_ = 2;
  local_200 = vpermps_avx2(auVar130,local_740);
  auVar131._8_4_ = 3;
  auVar131._0_8_ = 0x300000003;
  auVar131._12_4_ = 3;
  auVar131._16_4_ = 3;
  auVar131._20_4_ = 3;
  auVar131._24_4_ = 3;
  auVar131._28_4_ = 3;
  local_220 = vpermps_avx2(auVar131,local_740);
  local_240 = auVar92._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_780 = ZEXT1632(auVar92);
  local_260 = vpermps_avx2(auVar129,local_780);
  local_280 = vpermps_avx2(auVar130,local_780);
  local_2a0 = vpermps_avx2(auVar131,local_780);
  local_2c0 = auVar99._0_4_;
  uStack_2bc = local_2c0;
  uStack_2b8 = local_2c0;
  uStack_2b4 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2ac = local_2c0;
  uStack_2a8 = local_2c0;
  uStack_2a4 = local_2c0;
  local_760 = ZEXT1632(auVar99);
  local_2e0 = vpermps_avx2(auVar129,local_760);
  local_300 = vpermps_avx2(auVar130,local_760);
  local_320 = vpermps_avx2(auVar131,local_760);
  local_340 = auVar89._0_4_;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  _local_7a0 = ZEXT1632(auVar89);
  _local_360 = vpermps_avx2(auVar129,_local_7a0);
  local_380 = vpermps_avx2(auVar130,_local_7a0);
  _local_3a0 = vpermps_avx2(auVar131,_local_7a0);
  auVar91 = vmulss_avx512f(auVar242,auVar242);
  auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),local_800,local_800);
  local_4a0 = vfmadd231ps_avx512vl(auVar105,local_7e0,local_7e0);
  local_3c0._0_4_ = local_4a0._0_4_;
  local_3c0._4_4_ = local_3c0._0_4_;
  local_3c0._8_4_ = local_3c0._0_4_;
  local_3c0._12_4_ = local_3c0._0_4_;
  local_3c0._16_4_ = local_3c0._0_4_;
  local_3c0._20_4_ = local_3c0._0_4_;
  local_3c0._24_4_ = local_3c0._0_4_;
  local_3c0._28_4_ = local_3c0._0_4_;
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3c0,auVar128);
  local_700 = ZEXT416((uint)local_3e0);
  local_3e0 = fVar205 - local_3e0;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_5f0 = vpbroadcastd_avx512vl();
  local_838 = 1;
  local_830 = 0;
  local_600 = vpbroadcastd_avx512vl();
  auVar91 = vsqrtss_avx(local_7c0,local_7c0);
  local_8d4 = auVar91._0_4_;
  auVar91 = vsqrtss_avx(local_7c0,local_7c0);
  local_8d8 = auVar91._0_4_;
  auVar203 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar254 = ZEXT3264(auVar105);
  do {
    local_850 = auVar203._0_16_;
    auVar91 = vmovshdup_avx(local_850);
    fVar227 = auVar203._0_4_;
    fVar152 = auVar91._0_4_ - fVar227;
    fVar232 = fVar152 * 0.04761905;
    auVar221._4_4_ = fVar227;
    auVar221._0_4_ = fVar227;
    auVar221._8_4_ = fVar227;
    auVar221._12_4_ = fVar227;
    auVar221._16_4_ = fVar227;
    auVar221._20_4_ = fVar227;
    auVar221._24_4_ = fVar227;
    auVar221._28_4_ = fVar227;
    auVar162._4_4_ = fVar152;
    auVar162._0_4_ = fVar152;
    auVar162._8_4_ = fVar152;
    auVar162._12_4_ = fVar152;
    auVar162._16_4_ = fVar152;
    auVar162._20_4_ = fVar152;
    auVar162._24_4_ = fVar152;
    auVar162._28_4_ = fVar152;
    auVar91 = vfmadd231ps_fma(auVar221,auVar162,_DAT_02020f20);
    auVar103 = vsubps_avx512vl(auVar254._0_32_,ZEXT1632(auVar91));
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar106 = vxorps_avx512vl(ZEXT1632(auVar91),auVar105);
    fVar230 = auVar103._0_4_;
    fVar231 = auVar103._4_4_;
    fVar204 = auVar103._8_4_;
    fVar236 = auVar103._12_4_;
    fVar233 = auVar103._16_4_;
    fVar237 = auVar103._20_4_;
    fVar238 = auVar103._24_4_;
    auVar38._4_4_ = fVar231 * fVar231 * auVar106._4_4_;
    auVar38._0_4_ = fVar230 * fVar230 * auVar106._0_4_;
    auVar38._8_4_ = fVar204 * fVar204 * auVar106._8_4_;
    auVar38._12_4_ = fVar236 * fVar236 * auVar106._12_4_;
    auVar38._16_4_ = fVar233 * fVar233 * auVar106._16_4_;
    auVar38._20_4_ = fVar237 * fVar237 * auVar106._20_4_;
    auVar38._24_4_ = fVar238 * fVar238 * auVar106._24_4_;
    auVar38._28_4_ = auVar106._28_4_;
    fVar152 = auVar91._0_4_;
    fVar227 = auVar91._4_4_;
    fVar228 = auVar91._8_4_;
    fVar229 = auVar91._12_4_;
    auVar203._28_36_ = auVar216._28_36_;
    auVar203._0_28_ =
         ZEXT1628(CONCAT412(fVar229 * fVar229,
                            CONCAT48(fVar228 * fVar228,CONCAT44(fVar227 * fVar227,fVar152 * fVar152)
                                    )));
    fVar241 = fVar152 * 3.0;
    fVar244 = fVar227 * 3.0;
    fVar245 = fVar228 * 3.0;
    fVar246 = fVar229 * 3.0;
    auVar216._28_36_ = auVar243._28_36_;
    auVar216._0_28_ = ZEXT1628(CONCAT412(fVar246,CONCAT48(fVar245,CONCAT44(fVar244,fVar241))));
    auVar186._0_4_ = (fVar241 + -5.0) * fVar152 * fVar152 + 2.0;
    auVar186._4_4_ = (fVar244 + -5.0) * fVar227 * fVar227 + 2.0;
    auVar186._8_4_ = (fVar245 + -5.0) * fVar228 * fVar228 + 2.0;
    auVar186._12_4_ = (fVar246 + -5.0) * fVar229 * fVar229 + 2.0;
    auVar186._16_4_ = 0x40000000;
    auVar186._20_4_ = 0x40000000;
    auVar186._24_4_ = 0x40000000;
    auVar186._28_4_ = 0x40000000;
    auVar254._0_4_ = fVar230 * fVar230;
    auVar254._4_4_ = fVar231 * fVar231;
    auVar254._8_4_ = fVar204 * fVar204;
    auVar254._12_4_ = fVar236 * fVar236;
    auVar254._16_4_ = fVar233 * fVar233;
    auVar254._20_4_ = fVar237 * fVar237;
    auVar254._28_36_ = auVar250._28_36_;
    auVar254._24_4_ = fVar238 * fVar238;
    auVar201._0_4_ = auVar254._0_4_ * (fVar230 * 3.0 + -5.0) + 2.0;
    auVar201._4_4_ = auVar254._4_4_ * (fVar231 * 3.0 + -5.0) + 2.0;
    auVar201._8_4_ = auVar254._8_4_ * (fVar204 * 3.0 + -5.0) + 2.0;
    auVar201._12_4_ = auVar254._12_4_ * (fVar236 * 3.0 + -5.0) + 2.0;
    auVar201._16_4_ = auVar254._16_4_ * (fVar233 * 3.0 + -5.0) + 2.0;
    auVar201._20_4_ = auVar254._20_4_ * (fVar237 * 3.0 + -5.0) + 2.0;
    auVar201._24_4_ = auVar254._24_4_ * (fVar238 * 3.0 + -5.0) + 2.0;
    auVar201._28_4_ = auVar240._28_4_ + -5.0 + 2.0;
    auVar105 = vxorps_avx512vl(auVar103,auVar105);
    auVar39._4_4_ = fVar227 * fVar227 * auVar105._4_4_;
    auVar39._0_4_ = fVar152 * fVar152 * auVar105._0_4_;
    auVar39._8_4_ = fVar228 * fVar228 * auVar105._8_4_;
    auVar39._12_4_ = fVar229 * fVar229 * auVar105._12_4_;
    auVar39._16_4_ = auVar105._16_4_ * 0.0 * 0.0;
    auVar39._20_4_ = auVar105._20_4_ * 0.0 * 0.0;
    auVar39._24_4_ = auVar105._24_4_ * 0.0 * 0.0;
    auVar39._28_4_ = auVar105._28_4_;
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar105 = vmulps_avx512vl(auVar38,auVar107);
    auVar108 = vmulps_avx512vl(auVar186,auVar107);
    auVar104 = vmulps_avx512vl(auVar201,auVar107);
    auVar109 = vmulps_avx512vl(auVar39,auVar107);
    auVar75._4_4_ = uStack_33c;
    auVar75._0_4_ = local_340;
    auVar75._8_4_ = uStack_338;
    auVar75._12_4_ = uStack_334;
    auVar75._16_4_ = uStack_330;
    auVar75._20_4_ = uStack_32c;
    auVar75._24_4_ = uStack_328;
    auVar75._28_4_ = uStack_324;
    auVar110 = vmulps_avx512vl(auVar75,auVar109);
    auVar40._4_4_ = (float)local_360._4_4_ * auVar109._4_4_;
    auVar40._0_4_ = (float)local_360._0_4_ * auVar109._0_4_;
    auVar40._8_4_ = fStack_358 * auVar109._8_4_;
    auVar40._12_4_ = fStack_354 * auVar109._12_4_;
    auVar40._16_4_ = fStack_350 * auVar109._16_4_;
    auVar40._20_4_ = fStack_34c * auVar109._20_4_;
    auVar40._24_4_ = fStack_348 * auVar109._24_4_;
    auVar40._28_4_ = auVar106._28_4_;
    auVar106 = vmulps_avx512vl(local_380,auVar109);
    auVar41._4_4_ = (float)local_3a0._4_4_ * auVar109._4_4_;
    auVar41._0_4_ = (float)local_3a0._0_4_ * auVar109._0_4_;
    auVar41._8_4_ = fStack_398 * auVar109._8_4_;
    auVar41._12_4_ = fStack_394 * auVar109._12_4_;
    auVar41._16_4_ = fStack_390 * auVar109._16_4_;
    auVar41._20_4_ = fStack_38c * auVar109._20_4_;
    auVar41._24_4_ = fStack_388 * auVar109._24_4_;
    auVar41._28_4_ = auVar109._28_4_;
    auVar76._4_4_ = uStack_2bc;
    auVar76._0_4_ = local_2c0;
    auVar76._8_4_ = uStack_2b8;
    auVar76._12_4_ = uStack_2b4;
    auVar76._16_4_ = uStack_2b0;
    auVar76._20_4_ = uStack_2ac;
    auVar76._24_4_ = uStack_2a8;
    auVar76._28_4_ = uStack_2a4;
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar76);
    auVar110 = vfmadd231ps_avx512vl(auVar40,auVar104,local_2e0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_300);
    auVar104 = vfmadd231ps_avx512vl(auVar41,local_320,auVar104);
    auVar77._4_4_ = uStack_23c;
    auVar77._0_4_ = local_240;
    auVar77._8_4_ = uStack_238;
    auVar77._12_4_ = uStack_234;
    auVar77._16_4_ = uStack_230;
    auVar77._20_4_ = uStack_22c;
    auVar77._24_4_ = uStack_228;
    auVar77._28_4_ = uStack_224;
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar77);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,local_260);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_280);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_2a0,auVar108);
    auVar72._4_4_ = uStack_47c;
    auVar72._0_4_ = local_480;
    auVar72._8_4_ = uStack_478;
    auVar72._12_4_ = uStack_474;
    auVar72._16_4_ = uStack_470;
    auVar72._20_4_ = uStack_46c;
    auVar72._24_4_ = uStack_468;
    auVar72._28_4_ = uStack_464;
    auVar91 = vfmadd231ps_fma(auVar109,auVar105,auVar72);
    auVar92 = vfmadd231ps_fma(auVar110,auVar105,local_1e0);
    local_880 = vfmadd231ps_avx512vl(auVar106,auVar105,local_200);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_220,auVar105);
    auVar42._4_4_ = (fVar231 + fVar231) * fVar227;
    auVar42._0_4_ = (fVar230 + fVar230) * fVar152;
    auVar42._8_4_ = (fVar204 + fVar204) * fVar228;
    auVar42._12_4_ = (fVar236 + fVar236) * fVar229;
    auVar42._16_4_ = (fVar233 + fVar233) * 0.0;
    auVar42._20_4_ = (fVar237 + fVar237) * 0.0;
    auVar42._24_4_ = (fVar238 + fVar238) * 0.0;
    auVar42._28_4_ = auVar108._28_4_;
    auVar105 = vsubps_avx(auVar42,auVar254._0_32_);
    auVar222._0_28_ =
         ZEXT1628(CONCAT412((fVar229 + fVar229) * (fVar246 + -5.0) + fVar246 * fVar229,
                            CONCAT48((fVar228 + fVar228) * (fVar245 + -5.0) + fVar245 * fVar228,
                                     CONCAT44((fVar227 + fVar227) * (fVar244 + -5.0) +
                                              fVar244 * fVar227,
                                              (fVar152 + fVar152) * (fVar241 + -5.0) +
                                              fVar241 * fVar152))));
    auVar222._28_4_ = auVar243._28_4_ + -5.0 + 0.0;
    auVar21._8_4_ = 0x40000000;
    auVar21._0_8_ = 0x4000000040000000;
    auVar21._12_4_ = 0x40000000;
    auVar21._16_4_ = 0x40000000;
    auVar21._20_4_ = 0x40000000;
    auVar21._24_4_ = 0x40000000;
    auVar21._28_4_ = 0x40000000;
    auVar106 = vaddps_avx512vl(auVar216._0_32_,auVar21);
    auVar43._4_4_ = (fVar231 + fVar231) * auVar106._4_4_;
    auVar43._0_4_ = (fVar230 + fVar230) * auVar106._0_4_;
    auVar43._8_4_ = (fVar204 + fVar204) * auVar106._8_4_;
    auVar43._12_4_ = (fVar236 + fVar236) * auVar106._12_4_;
    auVar43._16_4_ = (fVar233 + fVar233) * auVar106._16_4_;
    auVar43._20_4_ = (fVar237 + fVar237) * auVar106._20_4_;
    auVar43._24_4_ = (fVar238 + fVar238) * auVar106._24_4_;
    auVar43._28_4_ = auVar106._28_4_;
    auVar44._4_4_ = fVar231 * 3.0 * fVar231;
    auVar44._0_4_ = fVar230 * 3.0 * fVar230;
    auVar44._8_4_ = fVar204 * 3.0 * fVar204;
    auVar44._12_4_ = fVar236 * 3.0 * fVar236;
    auVar44._16_4_ = fVar233 * 3.0 * fVar233;
    auVar44._20_4_ = fVar237 * 3.0 * fVar237;
    auVar44._24_4_ = fVar238 * 3.0 * fVar238;
    auVar44._28_4_ = auVar103._28_4_;
    auVar103 = vsubps_avx(auVar43,auVar44);
    auVar106 = vsubps_avx(auVar203._0_32_,auVar42);
    auVar108 = vmulps_avx512vl(auVar105,auVar107);
    auVar109 = vmulps_avx512vl(auVar222,auVar107);
    auVar103 = vmulps_avx512vl(auVar103,auVar107);
    auVar106 = vmulps_avx512vl(auVar106,auVar107);
    auVar107 = vmulps_avx512vl(auVar75,auVar106);
    auVar45._4_4_ = (float)local_360._4_4_ * auVar106._4_4_;
    auVar45._0_4_ = (float)local_360._0_4_ * auVar106._0_4_;
    auVar45._8_4_ = fStack_358 * auVar106._8_4_;
    auVar45._12_4_ = fStack_354 * auVar106._12_4_;
    auVar45._16_4_ = fStack_350 * auVar106._16_4_;
    auVar45._20_4_ = fStack_34c * auVar106._20_4_;
    auVar45._24_4_ = fStack_348 * auVar106._24_4_;
    auVar45._28_4_ = uStack_344;
    auVar110 = vmulps_avx512vl(local_380,auVar106);
    auVar46._4_4_ = auVar106._4_4_ * (float)local_3a0._4_4_;
    auVar46._0_4_ = auVar106._0_4_ * (float)local_3a0._0_4_;
    auVar46._8_4_ = auVar106._8_4_ * fStack_398;
    auVar46._12_4_ = auVar106._12_4_ * fStack_394;
    auVar46._16_4_ = auVar106._16_4_ * fStack_390;
    auVar46._20_4_ = auVar106._20_4_ * fStack_38c;
    auVar46._24_4_ = auVar106._24_4_ * fStack_388;
    auVar46._28_4_ = auVar106._28_4_;
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar76);
    auVar107 = vfmadd231ps_avx512vl(auVar45,auVar103,local_2e0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,local_300);
    auVar103 = vfmadd231ps_avx512vl(auVar46,local_320,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,auVar77);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_260);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar109,local_280);
    auVar103 = vfmadd231ps_avx512vl(auVar103,local_2a0,auVar109);
    auVar73._4_4_ = uStack_47c;
    auVar73._0_4_ = local_480;
    auVar73._8_4_ = uStack_478;
    auVar73._12_4_ = uStack_474;
    auVar73._16_4_ = uStack_470;
    auVar73._20_4_ = uStack_46c;
    auVar73._24_4_ = uStack_468;
    auVar73._28_4_ = uStack_464;
    auVar89 = vfmadd231ps_fma(auVar106,auVar108,auVar73);
    auVar99 = vfmadd231ps_fma(auVar107,auVar108,local_1e0);
    auVar106 = vfmadd231ps_avx512vl(auVar110,auVar108,local_200);
    auVar103 = vfmadd231ps_avx512vl(auVar103,local_220,auVar108);
    auVar47._4_4_ = auVar89._4_4_ * fVar232;
    auVar47._0_4_ = auVar89._0_4_ * fVar232;
    auVar47._8_4_ = auVar89._8_4_ * fVar232;
    auVar47._12_4_ = auVar89._12_4_ * fVar232;
    auVar47._16_4_ = fVar232 * 0.0;
    auVar47._20_4_ = fVar232 * 0.0;
    auVar47._24_4_ = fVar232 * 0.0;
    auVar47._28_4_ = auVar105._28_4_;
    auVar250 = ZEXT3264(auVar47);
    auVar251._0_4_ = auVar99._0_4_ * fVar232;
    auVar251._4_4_ = auVar99._4_4_ * fVar232;
    auVar251._8_4_ = auVar99._8_4_ * fVar232;
    auVar251._12_4_ = auVar99._12_4_ * fVar232;
    auVar251._16_4_ = fVar232 * 0.0;
    auVar251._20_4_ = fVar232 * 0.0;
    auVar251._24_4_ = fVar232 * 0.0;
    auVar251._28_4_ = 0;
    auVar48._4_4_ = auVar106._4_4_ * fVar232;
    auVar48._0_4_ = auVar106._0_4_ * fVar232;
    auVar48._8_4_ = auVar106._8_4_ * fVar232;
    auVar48._12_4_ = auVar106._12_4_ * fVar232;
    auVar48._16_4_ = auVar106._16_4_ * fVar232;
    auVar48._20_4_ = auVar106._20_4_ * fVar232;
    auVar48._24_4_ = auVar106._24_4_ * fVar232;
    auVar48._28_4_ = auVar106._28_4_;
    fVar152 = auVar103._0_4_ * fVar232;
    fVar227 = auVar103._4_4_ * fVar232;
    auVar49._4_4_ = fVar227;
    auVar49._0_4_ = fVar152;
    fVar228 = auVar103._8_4_ * fVar232;
    auVar49._8_4_ = fVar228;
    fVar229 = auVar103._12_4_ * fVar232;
    auVar49._12_4_ = fVar229;
    fVar230 = auVar103._16_4_ * fVar232;
    auVar49._16_4_ = fVar230;
    fVar231 = auVar103._20_4_ * fVar232;
    auVar49._20_4_ = fVar231;
    fVar232 = auVar103._24_4_ * fVar232;
    auVar49._24_4_ = fVar232;
    auVar49._28_4_ = fStack_384;
    auVar125 = auVar257._0_32_;
    auVar89 = vxorps_avx512vl(auVar257._0_16_,auVar257._0_16_);
    auVar109 = vpermt2ps_avx512vl(ZEXT1632(auVar91),_DAT_0205fd20,ZEXT1632(auVar89));
    auVar110 = vpermt2ps_avx512vl(ZEXT1632(auVar92),_DAT_0205fd20,ZEXT1632(auVar89));
    auVar243 = ZEXT3264(auVar110);
    auVar106 = ZEXT1632(auVar89);
    auVar111 = vpermt2ps_avx512vl(local_880,_DAT_0205fd20,auVar106);
    auVar223._0_4_ = auVar104._0_4_ + fVar152;
    auVar223._4_4_ = auVar104._4_4_ + fVar227;
    auVar223._8_4_ = auVar104._8_4_ + fVar228;
    auVar223._12_4_ = auVar104._12_4_ + fVar229;
    auVar223._16_4_ = auVar104._16_4_ + fVar230;
    auVar223._20_4_ = auVar104._20_4_ + fVar231;
    auVar223._24_4_ = auVar104._24_4_ + fVar232;
    auVar223._28_4_ = auVar104._28_4_ + fStack_384;
    auVar105 = vmaxps_avx(auVar104,auVar223);
    auVar103 = vminps_avx(auVar104,auVar223);
    auVar104 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,auVar106);
    auVar112 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar106);
    auVar102 = vpermt2ps_avx512vl(auVar251,_DAT_0205fd20,auVar106);
    auVar123 = ZEXT1632(auVar89);
    auVar113 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar123);
    auVar106 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar123);
    auVar114 = vsubps_avx512vl(auVar104,auVar106);
    auVar106 = vsubps_avx(auVar109,ZEXT1632(auVar91));
    auVar107 = vsubps_avx(auVar110,ZEXT1632(auVar92));
    auVar100 = vsubps_avx512vl(auVar111,local_880);
    auVar108 = vmulps_avx512vl(auVar107,auVar48);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar251,auVar100);
    auVar101 = vmulps_avx512vl(auVar100,auVar47);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar48,auVar106);
    auVar115 = vmulps_avx512vl(auVar106,auVar251);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar47,auVar107);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar101 = vfmadd231ps_avx512vl(auVar115,auVar101,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar108);
    auVar108 = vmulps_avx512vl(auVar100,auVar100);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar115 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar106);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar240 = ZEXT3264(auVar108);
    auVar117 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar108);
    auVar116 = vfmadd132ps_avx512vl(auVar117,auVar116,auVar116);
    auVar101 = vmulps_avx512vl(auVar101,auVar116);
    auVar117 = vmulps_avx512vl(auVar107,auVar113);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar102,auVar100);
    auVar118 = vmulps_avx512vl(auVar100,auVar112);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar113,auVar106);
    auVar119 = vmulps_avx512vl(auVar106,auVar102);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar112,auVar107);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vmulps_avx512vl(auVar117,auVar116);
    auVar101 = vmaxps_avx512vl(auVar101,auVar116);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar116 = vmaxps_avx512vl(auVar114,auVar104);
    auVar105 = vmaxps_avx512vl(auVar105,auVar116);
    auVar116 = vaddps_avx512vl(auVar101,auVar105);
    auVar105 = vminps_avx512vl(auVar114,auVar104);
    auVar105 = vminps_avx(auVar103,auVar105);
    auVar105 = vsubps_avx512vl(auVar105,auVar101);
    auVar22._8_4_ = 0x3f800002;
    auVar22._0_8_ = 0x3f8000023f800002;
    auVar22._12_4_ = 0x3f800002;
    auVar22._16_4_ = 0x3f800002;
    auVar22._20_4_ = 0x3f800002;
    auVar22._24_4_ = 0x3f800002;
    auVar22._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar116,auVar22);
    auVar23._8_4_ = 0x3f7ffffc;
    auVar23._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar23._12_4_ = 0x3f7ffffc;
    auVar23._16_4_ = 0x3f7ffffc;
    auVar23._20_4_ = 0x3f7ffffc;
    auVar23._24_4_ = 0x3f7ffffc;
    auVar23._28_4_ = 0x3f7ffffc;
    auVar104 = vmulps_avx512vl(auVar105,auVar23);
    auVar50._4_4_ = auVar103._4_4_ * auVar103._4_4_;
    auVar50._0_4_ = auVar103._0_4_ * auVar103._0_4_;
    auVar50._8_4_ = auVar103._8_4_ * auVar103._8_4_;
    auVar50._12_4_ = auVar103._12_4_ * auVar103._12_4_;
    auVar50._16_4_ = auVar103._16_4_ * auVar103._16_4_;
    auVar50._20_4_ = auVar103._20_4_ * auVar103._20_4_;
    auVar50._24_4_ = auVar103._24_4_ * auVar103._24_4_;
    auVar50._28_4_ = auVar104._28_4_;
    auVar105 = vrsqrt14ps_avx512vl(auVar115);
    auVar24._8_4_ = 0xbf000000;
    auVar24._0_8_ = 0xbf000000bf000000;
    auVar24._12_4_ = 0xbf000000;
    auVar24._16_4_ = 0xbf000000;
    auVar24._20_4_ = 0xbf000000;
    auVar24._24_4_ = 0xbf000000;
    auVar24._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar115,auVar24);
    auVar51._4_4_ = auVar105._4_4_ * auVar103._4_4_;
    auVar51._0_4_ = auVar105._0_4_ * auVar103._0_4_;
    auVar51._8_4_ = auVar105._8_4_ * auVar103._8_4_;
    auVar51._12_4_ = auVar105._12_4_ * auVar103._12_4_;
    auVar51._16_4_ = auVar105._16_4_ * auVar103._16_4_;
    auVar51._20_4_ = auVar105._20_4_ * auVar103._20_4_;
    auVar51._24_4_ = auVar105._24_4_ * auVar103._24_4_;
    auVar51._28_4_ = auVar103._28_4_;
    auVar103 = vmulps_avx512vl(auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar51);
    auVar25._8_4_ = 0x3fc00000;
    auVar25._0_8_ = 0x3fc000003fc00000;
    auVar25._12_4_ = 0x3fc00000;
    auVar25._16_4_ = 0x3fc00000;
    auVar25._20_4_ = 0x3fc00000;
    auVar25._24_4_ = 0x3fc00000;
    auVar25._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar25);
    auVar52._4_4_ = auVar103._4_4_ * auVar106._4_4_;
    auVar52._0_4_ = auVar103._0_4_ * auVar106._0_4_;
    auVar52._8_4_ = auVar103._8_4_ * auVar106._8_4_;
    auVar52._12_4_ = auVar103._12_4_ * auVar106._12_4_;
    auVar52._16_4_ = auVar103._16_4_ * auVar106._16_4_;
    auVar52._20_4_ = auVar103._20_4_ * auVar106._20_4_;
    auVar52._24_4_ = auVar103._24_4_ * auVar106._24_4_;
    auVar52._28_4_ = auVar105._28_4_;
    auVar105 = vmulps_avx512vl(auVar107,auVar103);
    auVar114 = vmulps_avx512vl(auVar100,auVar103);
    local_8a0 = ZEXT1632(auVar91);
    auVar101 = vsubps_avx512vl(auVar123,local_8a0);
    local_640 = ZEXT1632(auVar92);
    auVar115 = vsubps_avx512vl(auVar123,local_640);
    auVar116 = vsubps_avx512vl(auVar123,local_880);
    auVar117 = vmulps_avx512vl(auVar255._0_32_,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar256._0_32_,auVar101);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar101,auVar101);
    auVar119 = vmulps_avx512vl(auVar255._0_32_,auVar114);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar105,auVar125);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar52,auVar256._0_32_);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar105 = vfmadd231ps_avx512vl(auVar114,auVar115,auVar105);
    auVar114 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar52);
    local_680 = vmulps_avx512vl(auVar119,auVar119);
    auVar105 = vsubps_avx(local_3c0,local_680);
    auVar120 = vmulps_avx512vl(auVar119,auVar114);
    auVar117 = vsubps_avx512vl(auVar117,auVar120);
    auVar117 = vaddps_avx512vl(auVar117,auVar117);
    auVar120 = vmulps_avx512vl(auVar114,auVar114);
    local_660 = vsubps_avx512vl(auVar118,auVar120);
    auVar118 = vsubps_avx512vl(local_660,auVar50);
    auVar120 = vmulps_avx512vl(auVar117,auVar117);
    auVar26._8_4_ = 0x40800000;
    auVar26._0_8_ = 0x4080000040800000;
    auVar26._12_4_ = 0x40800000;
    auVar26._16_4_ = 0x40800000;
    auVar26._20_4_ = 0x40800000;
    auVar26._24_4_ = 0x40800000;
    auVar26._28_4_ = 0x40800000;
    auVar121 = vmulps_avx512vl(auVar105,auVar26);
    auVar122 = vmulps_avx512vl(auVar121,auVar118);
    auVar122 = vsubps_avx512vl(auVar120,auVar122);
    uVar87 = vcmpps_avx512vl(auVar122,auVar123,5);
    bVar78 = (byte)uVar87;
    if (bVar78 == 0) {
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar122 = vsqrtps_avx512vl(auVar122);
      auVar123 = vaddps_avx512vl(auVar105,auVar105);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar108 = vfnmadd213ps_avx512vl(auVar123,auVar124,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,auVar124,auVar124);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      auVar123 = vxorps_avx512vl(auVar117,auVar27);
      auVar123 = vsubps_avx512vl(auVar123,auVar122);
      auVar123 = vmulps_avx512vl(auVar123,auVar108);
      auVar122 = vsubps_avx512vl(auVar122,auVar117);
      auVar108 = vmulps_avx512vl(auVar122,auVar108);
      auVar122 = vfmadd213ps_avx512vl(auVar119,auVar123,auVar114);
      local_4e0 = vmulps_avx512vl(auVar103,auVar122);
      auVar122 = vfmadd213ps_avx512vl(auVar119,auVar108,auVar114);
      local_500 = vmulps_avx512vl(auVar103,auVar122);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar122 = vblendmps_avx512vl(auVar122,auVar123);
      auVar126._0_4_ =
           (uint)(bVar78 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar78 & 1) * local_500._0_4_;
      bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * local_500._4_4_;
      bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * local_500._8_4_;
      bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * local_500._12_4_;
      bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * local_500._16_4_;
      bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * local_500._20_4_;
      bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * local_500._24_4_;
      bVar6 = SUB81(uVar87 >> 7,0);
      auVar126._28_4_ = (uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * local_500._28_4_;
      auVar212._8_4_ = 0xff800000;
      auVar212._0_8_ = 0xff800000ff800000;
      auVar212._12_4_ = 0xff800000;
      auVar212._16_4_ = 0xff800000;
      auVar212._20_4_ = 0xff800000;
      auVar212._24_4_ = 0xff800000;
      auVar212._28_4_ = 0xff800000;
      auVar122 = vblendmps_avx512vl(auVar212,auVar108);
      auVar127._0_4_ =
           (uint)(bVar78 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar108._0_4_;
      bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * auVar108._4_4_;
      bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * auVar108._8_4_;
      bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * auVar108._12_4_;
      bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * auVar108._16_4_;
      bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * auVar108._20_4_;
      bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * auVar108._24_4_;
      bVar6 = SUB81(uVar87 >> 7,0);
      auVar127._28_4_ = (uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * auVar108._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_680,auVar122);
      auVar108 = vmaxps_avx(local_4a0,auVar122);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      auVar125 = vmulps_avx512vl(auVar108,auVar28);
      vandps_avx512vl(auVar105,auVar122);
      uVar80 = vcmpps_avx512vl(auVar125,auVar125,1);
      uVar87 = uVar87 & uVar80;
      bVar82 = (byte)uVar87;
      if (bVar82 != 0) {
        uVar80 = vcmpps_avx512vl(auVar118,_DAT_02020f00,2);
        auVar225._8_4_ = 0xff800000;
        auVar225._0_8_ = 0xff800000ff800000;
        auVar225._12_4_ = 0xff800000;
        auVar225._16_4_ = 0xff800000;
        auVar225._20_4_ = 0xff800000;
        auVar225._24_4_ = 0xff800000;
        auVar225._28_4_ = 0xff800000;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vblendmps_avx512vl(auVar108,auVar225);
        bVar81 = (byte)uVar80;
        uVar88 = (uint)(bVar81 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar125._0_4_;
        bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
        uVar145 = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar125._4_4_;
        bVar6 = (bool)((byte)(uVar80 >> 2) & 1);
        uVar146 = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar125._8_4_;
        bVar6 = (bool)((byte)(uVar80 >> 3) & 1);
        uVar147 = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar125._12_4_;
        bVar6 = (bool)((byte)(uVar80 >> 4) & 1);
        uVar148 = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar125._16_4_;
        bVar6 = (bool)((byte)(uVar80 >> 5) & 1);
        uVar149 = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar125._20_4_;
        bVar6 = (bool)((byte)(uVar80 >> 6) & 1);
        uVar150 = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar125._24_4_;
        bVar6 = SUB81(uVar80 >> 7,0);
        uVar151 = (uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar125._28_4_;
        auVar126._0_4_ = (bVar82 & 1) * uVar88 | !(bool)(bVar82 & 1) * auVar126._0_4_;
        bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar126._4_4_ = bVar6 * uVar145 | !bVar6 * auVar126._4_4_;
        bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar126._8_4_ = bVar6 * uVar146 | !bVar6 * auVar126._8_4_;
        bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar126._12_4_ = bVar6 * uVar147 | !bVar6 * auVar126._12_4_;
        bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar126._16_4_ = bVar6 * uVar148 | !bVar6 * auVar126._16_4_;
        bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar126._20_4_ = bVar6 * uVar149 | !bVar6 * auVar126._20_4_;
        bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar126._24_4_ = bVar6 * uVar150 | !bVar6 * auVar126._24_4_;
        bVar6 = SUB81(uVar87 >> 7,0);
        auVar126._28_4_ = bVar6 * uVar151 | !bVar6 * auVar126._28_4_;
        auVar108 = vblendmps_avx512vl(auVar225,auVar108);
        auVar125._0_4_ = (uint)(bVar81 & 1) * auVar108._0_4_ | !(bool)(bVar81 & 1) * uVar88;
        bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar6 * auVar108._4_4_ | !bVar6 * uVar145;
        bVar6 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar6 * auVar108._8_4_ | !bVar6 * uVar146;
        bVar6 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar6 * auVar108._12_4_ | !bVar6 * uVar147;
        bVar6 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar6 * auVar108._16_4_ | !bVar6 * uVar148;
        bVar6 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar6 * auVar108._20_4_ | !bVar6 * uVar149;
        bVar6 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar6 * auVar108._24_4_ | !bVar6 * uVar150;
        bVar6 = SUB81(uVar80 >> 7,0);
        auVar125._28_4_ = (uint)bVar6 * auVar108._28_4_ | !bVar6 * uVar151;
        auVar127._0_4_ = (bVar82 & 1) * auVar125._0_4_ | !(bool)(bVar82 & 1) * auVar127._0_4_;
        bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar127._4_4_ = bVar6 * auVar125._4_4_ | !bVar6 * auVar127._4_4_;
        bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar127._8_4_ = bVar6 * auVar125._8_4_ | !bVar6 * auVar127._8_4_;
        bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar127._12_4_ = bVar6 * auVar125._12_4_ | !bVar6 * auVar127._12_4_;
        bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar127._16_4_ = bVar6 * auVar125._16_4_ | !bVar6 * auVar127._16_4_;
        bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar127._20_4_ = bVar6 * auVar125._20_4_ | !bVar6 * auVar127._20_4_;
        bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar127._24_4_ = bVar6 * auVar125._24_4_ | !bVar6 * auVar127._24_4_;
        bVar6 = SUB81(uVar87 >> 7,0);
        auVar127._28_4_ = bVar6 * auVar125._28_4_ | !bVar6 * auVar127._28_4_;
        bVar78 = (~bVar82 | bVar81) & bVar78;
      }
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar216 = ZEXT3264(auVar125);
    auVar254 = ZEXT3264(auVar108);
    if ((bVar78 & 0x7f) == 0) {
      auVar256 = ZEXT3264(local_7e0);
      auVar257 = ZEXT3264(local_800);
      auVar255 = ZEXT3264(local_820);
    }
    else {
      fVar152 = *(float *)(ray + k * 4 + 0x80) - (float)local_700._0_4_;
      auVar213._4_4_ = fVar152;
      auVar213._0_4_ = fVar152;
      auVar213._8_4_ = fVar152;
      auVar213._12_4_ = fVar152;
      auVar213._16_4_ = fVar152;
      auVar213._20_4_ = fVar152;
      auVar213._24_4_ = fVar152;
      auVar213._28_4_ = fVar152;
      auVar118 = vminps_avx512vl(auVar213,auVar127);
      auVar74._4_4_ = fStack_3dc;
      auVar74._0_4_ = local_3e0;
      auVar74._8_4_ = fStack_3d8;
      auVar74._12_4_ = fStack_3d4;
      auVar74._16_4_ = fStack_3d0;
      auVar74._20_4_ = fStack_3cc;
      auVar74._24_4_ = fStack_3c8;
      auVar74._28_4_ = fStack_3c4;
      auVar122 = vmaxps_avx512vl(auVar74,auVar126);
      auVar116 = vmulps_avx512vl(auVar116,auVar48);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar251,auVar116);
      auVar101 = vfmadd213ps_avx512vl(auVar101,auVar47,auVar115);
      auVar255 = ZEXT3264(local_820);
      auVar115 = vmulps_avx512vl(local_820,auVar48);
      auVar257 = ZEXT3264(local_800);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_800,auVar251);
      auVar256 = ZEXT3264(local_7e0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_7e0,auVar47);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar116);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar116,auVar123,1);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = vxorps_avx512vl(auVar101,auVar124);
      auVar128 = vrcp14ps_avx512vl(auVar115);
      auVar129 = vxorps_avx512vl(auVar115,auVar124);
      auVar130 = vfnmadd213ps_avx512vl(auVar128,auVar115,auVar108);
      auVar130 = vfmadd132ps_avx512vl(auVar130,auVar128,auVar128);
      auVar130 = vmulps_avx512vl(auVar130,auVar101);
      uVar14 = vcmpps_avx512vl(auVar115,auVar129,1);
      bVar82 = (byte)uVar13 | (byte)uVar14;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar130,auVar131);
      auVar132._0_4_ =
           (uint)(bVar82 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar128._0_4_;
      bVar6 = (bool)(bVar82 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar6 * auVar101._4_4_ | (uint)!bVar6 * auVar128._4_4_;
      bVar6 = (bool)(bVar82 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar6 * auVar101._8_4_ | (uint)!bVar6 * auVar128._8_4_;
      bVar6 = (bool)(bVar82 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar6 * auVar101._12_4_ | (uint)!bVar6 * auVar128._12_4_;
      bVar6 = (bool)(bVar82 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * auVar128._16_4_;
      bVar6 = (bool)(bVar82 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar6 * auVar101._20_4_ | (uint)!bVar6 * auVar128._20_4_;
      bVar6 = (bool)(bVar82 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar6 * auVar101._24_4_ | (uint)!bVar6 * auVar128._24_4_;
      auVar132._28_4_ =
           (uint)(bVar82 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar128._28_4_;
      auVar101 = vmaxps_avx(auVar122,auVar132);
      uVar14 = vcmpps_avx512vl(auVar115,auVar129,6);
      bVar82 = (byte)uVar13 | (byte)uVar14;
      auVar133._0_4_ = (uint)(bVar82 & 1) * 0x7f800000 | (uint)!(bool)(bVar82 & 1) * auVar130._0_4_;
      bVar6 = (bool)(bVar82 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar130._4_4_;
      bVar6 = (bool)(bVar82 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar130._8_4_;
      bVar6 = (bool)(bVar82 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar130._12_4_;
      bVar6 = (bool)(bVar82 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar130._16_4_;
      bVar6 = (bool)(bVar82 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar130._20_4_;
      bVar6 = (bool)(bVar82 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar130._24_4_;
      auVar133._28_4_ =
           (uint)(bVar82 >> 7) * 0x7f800000 | (uint)!(bool)(bVar82 >> 7) * auVar130._28_4_;
      auVar115 = vminps_avx(auVar118,auVar133);
      auVar216 = ZEXT3264(auVar115);
      auVar91 = vxorps_avx512vl(auVar129._0_16_,auVar129._0_16_);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar91),auVar109);
      auVar110 = vsubps_avx512vl(ZEXT1632(auVar91),auVar110);
      auVar118 = ZEXT1632(auVar91);
      auVar111 = vsubps_avx512vl(auVar118,auVar111);
      auVar53._4_4_ = auVar111._4_4_ * auVar113._4_4_;
      auVar53._0_4_ = auVar111._0_4_ * auVar113._0_4_;
      auVar53._8_4_ = auVar111._8_4_ * auVar113._8_4_;
      auVar53._12_4_ = auVar111._12_4_ * auVar113._12_4_;
      auVar53._16_4_ = auVar111._16_4_ * auVar113._16_4_;
      auVar53._20_4_ = auVar111._20_4_ * auVar113._20_4_;
      auVar53._24_4_ = auVar111._24_4_ * auVar113._24_4_;
      auVar53._28_4_ = auVar111._28_4_;
      auVar110 = vfnmsub231ps_avx512vl(auVar53,auVar102,auVar110);
      auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar112,auVar109);
      auVar110 = vmulps_avx512vl(local_820,auVar113);
      auVar110 = vfnmsub231ps_avx512vl(auVar110,local_800,auVar102);
      auVar110 = vfnmadd231ps_avx512vl(auVar110,local_7e0,auVar112);
      vandps_avx512vl(auVar110,auVar116);
      uVar13 = vcmpps_avx512vl(auVar110,auVar123,1);
      auVar109 = vxorps_avx512vl(auVar109,auVar124);
      auVar111 = vrcp14ps_avx512vl(auVar110);
      auVar112 = vxorps_avx512vl(auVar110,auVar124);
      auVar250 = ZEXT3264(auVar112);
      auVar113 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar108);
      auVar91 = vfmadd132ps_fma(auVar113,auVar111,auVar111);
      fVar152 = auVar91._0_4_ * auVar109._0_4_;
      fVar227 = auVar91._4_4_ * auVar109._4_4_;
      auVar54._4_4_ = fVar227;
      auVar54._0_4_ = fVar152;
      fVar228 = auVar91._8_4_ * auVar109._8_4_;
      auVar54._8_4_ = fVar228;
      fVar229 = auVar91._12_4_ * auVar109._12_4_;
      auVar54._12_4_ = fVar229;
      fVar232 = auVar109._16_4_ * 0.0;
      auVar54._16_4_ = fVar232;
      fVar230 = auVar109._20_4_ * 0.0;
      auVar54._20_4_ = fVar230;
      fVar231 = auVar109._24_4_ * 0.0;
      auVar54._24_4_ = fVar231;
      auVar54._28_4_ = auVar109._28_4_;
      uVar14 = vcmpps_avx512vl(auVar110,auVar112,1);
      bVar82 = (byte)uVar13 | (byte)uVar14;
      auVar113 = vblendmps_avx512vl(auVar54,auVar131);
      auVar134._0_4_ =
           (uint)(bVar82 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar111._0_4_;
      bVar6 = (bool)(bVar82 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar6 * auVar113._4_4_ | (uint)!bVar6 * auVar111._4_4_;
      bVar6 = (bool)(bVar82 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * auVar111._8_4_;
      bVar6 = (bool)(bVar82 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar6 * auVar113._12_4_ | (uint)!bVar6 * auVar111._12_4_;
      bVar6 = (bool)(bVar82 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * auVar111._16_4_;
      bVar6 = (bool)(bVar82 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar6 * auVar113._20_4_ | (uint)!bVar6 * auVar111._20_4_;
      bVar6 = (bool)(bVar82 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar6 * auVar113._24_4_ | (uint)!bVar6 * auVar111._24_4_;
      auVar134._28_4_ =
           (uint)(bVar82 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar111._28_4_;
      _local_6c0 = vmaxps_avx(auVar101,auVar134);
      uVar14 = vcmpps_avx512vl(auVar110,auVar112,6);
      bVar82 = (byte)uVar13 | (byte)uVar14;
      auVar135._0_4_ = (uint)(bVar82 & 1) * 0x7f800000 | (uint)!(bool)(bVar82 & 1) * (int)fVar152;
      bVar6 = (bool)(bVar82 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar227;
      bVar6 = (bool)(bVar82 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar228;
      bVar6 = (bool)(bVar82 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar229;
      bVar6 = (bool)(bVar82 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar232;
      bVar6 = (bool)(bVar82 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar230;
      bVar6 = (bool)(bVar82 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar231;
      auVar135._28_4_ =
           (uint)(bVar82 >> 7) * 0x7f800000 | (uint)!(bool)(bVar82 >> 7) * auVar109._28_4_;
      auVar243 = ZEXT3264(auVar135);
      local_440 = vminps_avx(auVar115,auVar135);
      auVar240 = ZEXT3264(local_440);
      uVar13 = vcmpps_avx512vl(_local_6c0,local_440,2);
      bVar78 = bVar78 & 0x7f & (byte)uVar13;
      if (bVar78 != 0) {
        auVar110 = vmaxps_avx512vl(auVar118,auVar104);
        auVar104 = vminps_avx512vl(local_4e0,auVar108);
        auVar60 = ZEXT412(0);
        auVar109 = ZEXT1232(auVar60) << 0x20;
        auVar104 = vmaxps_avx(auVar104,ZEXT1232(auVar60) << 0x20);
        auVar111 = vminps_avx512vl(local_500,auVar108);
        auVar55._4_4_ = (auVar104._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar104._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar104._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar104._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar104._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar104._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar104._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar104._28_4_ + 7.0;
        auVar91 = vfmadd213ps_fma(auVar55,auVar162,auVar221);
        local_4e0 = ZEXT1632(auVar91);
        auVar104 = vmaxps_avx(auVar111,ZEXT1232(auVar60) << 0x20);
        auVar56._4_4_ = (auVar104._4_4_ + 1.0) * 0.125;
        auVar56._0_4_ = (auVar104._0_4_ + 0.0) * 0.125;
        auVar56._8_4_ = (auVar104._8_4_ + 2.0) * 0.125;
        auVar56._12_4_ = (auVar104._12_4_ + 3.0) * 0.125;
        auVar56._16_4_ = (auVar104._16_4_ + 4.0) * 0.125;
        auVar56._20_4_ = (auVar104._20_4_ + 5.0) * 0.125;
        auVar56._24_4_ = (auVar104._24_4_ + 6.0) * 0.125;
        auVar56._28_4_ = auVar104._28_4_ + 7.0;
        auVar91 = vfmadd213ps_fma(auVar56,auVar162,auVar221);
        local_500 = ZEXT1632(auVar91);
        auVar214._0_4_ = auVar110._0_4_ * auVar110._0_4_;
        auVar214._4_4_ = auVar110._4_4_ * auVar110._4_4_;
        auVar214._8_4_ = auVar110._8_4_ * auVar110._8_4_;
        auVar214._12_4_ = auVar110._12_4_ * auVar110._12_4_;
        auVar214._16_4_ = auVar110._16_4_ * auVar110._16_4_;
        auVar214._20_4_ = auVar110._20_4_ * auVar110._20_4_;
        auVar214._24_4_ = auVar110._24_4_ * auVar110._24_4_;
        auVar214._28_4_ = 0;
        auVar104 = vsubps_avx(local_660,auVar214);
        auVar110 = vmulps_avx512vl(auVar121,auVar104);
        auVar110 = vsubps_avx512vl(auVar120,auVar110);
        uVar13 = vcmpps_avx512vl(auVar110,ZEXT1232(auVar60) << 0x20,5);
        bVar82 = (byte)uVar13;
        if (bVar82 == 0) {
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar216 = ZEXT864(0) << 0x20;
          auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar243 = ZEXT864(0) << 0x20;
          auVar136._8_4_ = 0x7f800000;
          auVar136._0_8_ = 0x7f8000007f800000;
          auVar136._12_4_ = 0x7f800000;
          auVar136._16_4_ = 0x7f800000;
          auVar136._20_4_ = 0x7f800000;
          auVar136._24_4_ = 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar137._8_4_ = 0xff800000;
          auVar137._0_8_ = 0xff800000ff800000;
          auVar137._12_4_ = 0xff800000;
          auVar137._16_4_ = 0xff800000;
          auVar137._20_4_ = 0xff800000;
          auVar137._24_4_ = 0xff800000;
          auVar137._28_4_ = 0xff800000;
        }
        else {
          auVar92 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
          uVar87 = vcmpps_avx512vl(auVar110,auVar118,5);
          auVar109 = vsqrtps_avx(auVar110);
          auVar224._0_4_ = auVar105._0_4_ + auVar105._0_4_;
          auVar224._4_4_ = auVar105._4_4_ + auVar105._4_4_;
          auVar224._8_4_ = auVar105._8_4_ + auVar105._8_4_;
          auVar224._12_4_ = auVar105._12_4_ + auVar105._12_4_;
          auVar224._16_4_ = auVar105._16_4_ + auVar105._16_4_;
          auVar224._20_4_ = auVar105._20_4_ + auVar105._20_4_;
          auVar224._24_4_ = auVar105._24_4_ + auVar105._24_4_;
          auVar224._28_4_ = auVar105._28_4_ + auVar105._28_4_;
          auVar110 = vrcp14ps_avx512vl(auVar224);
          auVar108 = vfnmadd213ps_avx512vl(auVar224,auVar110,auVar108);
          auVar91 = vfmadd132ps_fma(auVar108,auVar110,auVar110);
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar29._16_4_ = 0x80000000;
          auVar29._20_4_ = 0x80000000;
          auVar29._24_4_ = 0x80000000;
          auVar29._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar117,auVar29);
          auVar108 = vsubps_avx(auVar108,auVar109);
          auVar57._4_4_ = auVar108._4_4_ * auVar91._4_4_;
          auVar57._0_4_ = auVar108._0_4_ * auVar91._0_4_;
          auVar57._8_4_ = auVar108._8_4_ * auVar91._8_4_;
          auVar57._12_4_ = auVar108._12_4_ * auVar91._12_4_;
          auVar57._16_4_ = auVar108._16_4_ * 0.0;
          auVar57._20_4_ = auVar108._20_4_ * 0.0;
          auVar57._24_4_ = auVar108._24_4_ * 0.0;
          auVar57._28_4_ = 0x3e000000;
          auVar109 = vsubps_avx512vl(auVar109,auVar117);
          auVar58._4_4_ = auVar109._4_4_ * auVar91._4_4_;
          auVar58._0_4_ = auVar109._0_4_ * auVar91._0_4_;
          auVar58._8_4_ = auVar109._8_4_ * auVar91._8_4_;
          auVar58._12_4_ = auVar109._12_4_ * auVar91._12_4_;
          auVar58._16_4_ = auVar109._16_4_ * 0.0;
          auVar58._20_4_ = auVar109._20_4_ * 0.0;
          auVar58._24_4_ = auVar109._24_4_ * 0.0;
          auVar58._28_4_ = 0x7f800000;
          auVar109 = vfmadd213ps_avx512vl(auVar119,auVar57,auVar114);
          auVar59._4_4_ = auVar103._4_4_ * auVar109._4_4_;
          auVar59._0_4_ = auVar103._0_4_ * auVar109._0_4_;
          auVar59._8_4_ = auVar103._8_4_ * auVar109._8_4_;
          auVar59._12_4_ = auVar103._12_4_ * auVar109._12_4_;
          auVar59._16_4_ = auVar103._16_4_ * auVar109._16_4_;
          auVar59._20_4_ = auVar103._20_4_ * auVar109._20_4_;
          auVar59._24_4_ = auVar103._24_4_ * auVar109._24_4_;
          auVar59._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(local_7e0,auVar57);
          auVar109 = vmulps_avx512vl(local_800,auVar57);
          auVar110 = vmulps_avx512vl(local_820,auVar57);
          auVar111 = vfmadd213ps_avx512vl(auVar106,auVar59,local_8a0);
          auVar108 = vsubps_avx512vl(auVar108,auVar111);
          auVar216 = ZEXT3264(auVar108);
          auVar108 = vfmadd213ps_avx512vl(auVar107,auVar59,local_640);
          auVar108 = vsubps_avx512vl(auVar109,auVar108);
          auVar91 = vfmadd213ps_fma(auVar59,auVar100,local_880);
          auVar109 = vsubps_avx(auVar110,ZEXT1632(auVar91));
          auVar243 = ZEXT3264(auVar109);
          auVar109 = vfmadd213ps_avx512vl(auVar119,auVar58,auVar114);
          auVar110 = vmulps_avx512vl(auVar103,auVar109);
          auVar103 = vmulps_avx512vl(local_7e0,auVar58);
          auVar111 = vmulps_avx512vl(local_800,auVar58);
          auVar112 = vmulps_avx512vl(local_820,auVar58);
          auVar91 = vfmadd213ps_fma(auVar106,auVar110,local_8a0);
          auVar109 = vsubps_avx(auVar103,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar107,auVar110,local_640);
          auVar103 = vsubps_avx512vl(auVar111,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar100,auVar110,local_880);
          auVar106 = vsubps_avx512vl(auVar112,ZEXT1632(auVar91));
          auVar163._8_4_ = 0x7f800000;
          auVar163._0_8_ = 0x7f8000007f800000;
          auVar163._12_4_ = 0x7f800000;
          auVar163._16_4_ = 0x7f800000;
          auVar163._20_4_ = 0x7f800000;
          auVar163._24_4_ = 0x7f800000;
          auVar163._28_4_ = 0x7f800000;
          auVar107 = vblendmps_avx512vl(auVar163,auVar57);
          bVar6 = (bool)((byte)uVar87 & 1);
          auVar136._0_4_ = (uint)bVar6 * auVar107._0_4_ | (uint)!bVar6 * local_880._0_4_;
          bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar6 * auVar107._4_4_ | (uint)!bVar6 * local_880._4_4_;
          bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar6 * auVar107._8_4_ | (uint)!bVar6 * local_880._8_4_;
          bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * local_880._12_4_;
          bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar6 * auVar107._16_4_ | (uint)!bVar6 * local_880._16_4_;
          bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar6 * auVar107._20_4_ | (uint)!bVar6 * local_880._20_4_;
          bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar6 * auVar107._24_4_ | (uint)!bVar6 * local_880._24_4_;
          bVar6 = SUB81(uVar87 >> 7,0);
          auVar136._28_4_ = (uint)bVar6 * auVar107._28_4_ | (uint)!bVar6 * local_880._28_4_;
          auVar164._8_4_ = 0xff800000;
          auVar164._0_8_ = 0xff800000ff800000;
          auVar164._12_4_ = 0xff800000;
          auVar164._16_4_ = 0xff800000;
          auVar164._20_4_ = 0xff800000;
          auVar164._24_4_ = 0xff800000;
          auVar164._28_4_ = 0xff800000;
          auVar107 = vblendmps_avx512vl(auVar164,auVar58);
          bVar6 = (bool)((byte)uVar87 & 1);
          auVar137._0_4_ = (uint)bVar6 * auVar107._0_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar6 * auVar107._4_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar6 * auVar107._8_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar6 * auVar107._16_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar6 * auVar107._20_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar6 * auVar107._24_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = SUB81(uVar87 >> 7,0);
          auVar137._28_4_ = (uint)bVar6 * auVar107._28_4_ | (uint)!bVar6 * -0x800000;
          auVar234._8_4_ = 0x7fffffff;
          auVar234._0_8_ = 0x7fffffff7fffffff;
          auVar234._12_4_ = 0x7fffffff;
          auVar234._16_4_ = 0x7fffffff;
          auVar234._20_4_ = 0x7fffffff;
          auVar234._24_4_ = 0x7fffffff;
          auVar234._28_4_ = 0x7fffffff;
          auVar107 = vandps_avx(auVar234,local_680);
          auVar107 = vmaxps_avx(local_4a0,auVar107);
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar107 = vmulps_avx512vl(auVar107,auVar30);
          auVar105 = vandps_avx(auVar105,auVar234);
          uVar80 = vcmpps_avx512vl(auVar105,auVar107,1);
          uVar87 = uVar87 & uVar80;
          bVar81 = (byte)uVar87;
          if (bVar81 != 0) {
            uVar80 = vcmpps_avx512vl(auVar104,ZEXT1632(auVar92),2);
            auVar235._8_4_ = 0xff800000;
            auVar235._0_8_ = 0xff800000ff800000;
            auVar235._12_4_ = 0xff800000;
            auVar235._16_4_ = 0xff800000;
            auVar235._20_4_ = 0xff800000;
            auVar235._24_4_ = 0xff800000;
            auVar235._28_4_ = 0xff800000;
            auVar249._8_4_ = 0x7f800000;
            auVar249._0_8_ = 0x7f8000007f800000;
            auVar249._12_4_ = 0x7f800000;
            auVar249._16_4_ = 0x7f800000;
            auVar249._20_4_ = 0x7f800000;
            auVar249._24_4_ = 0x7f800000;
            auVar249._28_4_ = 0x7f800000;
            auVar105 = vblendmps_avx512vl(auVar249,auVar235);
            bVar79 = (byte)uVar80;
            uVar88 = (uint)(bVar79 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar79 & 1) * auVar107._0_4_;
            bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
            uVar145 = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * auVar107._4_4_;
            bVar6 = (bool)((byte)(uVar80 >> 2) & 1);
            uVar146 = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * auVar107._8_4_;
            bVar6 = (bool)((byte)(uVar80 >> 3) & 1);
            uVar147 = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * auVar107._12_4_;
            bVar6 = (bool)((byte)(uVar80 >> 4) & 1);
            uVar148 = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * auVar107._16_4_;
            bVar6 = (bool)((byte)(uVar80 >> 5) & 1);
            uVar149 = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * auVar107._20_4_;
            bVar6 = (bool)((byte)(uVar80 >> 6) & 1);
            uVar150 = (uint)bVar6 * auVar105._24_4_ | (uint)!bVar6 * auVar107._24_4_;
            bVar6 = SUB81(uVar80 >> 7,0);
            uVar151 = (uint)bVar6 * auVar105._28_4_ | (uint)!bVar6 * auVar107._28_4_;
            auVar136._0_4_ = (bVar81 & 1) * uVar88 | !(bool)(bVar81 & 1) * auVar136._0_4_;
            bVar6 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar136._4_4_ = bVar6 * uVar145 | !bVar6 * auVar136._4_4_;
            bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar136._8_4_ = bVar6 * uVar146 | !bVar6 * auVar136._8_4_;
            bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar136._12_4_ = bVar6 * uVar147 | !bVar6 * auVar136._12_4_;
            bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar136._16_4_ = bVar6 * uVar148 | !bVar6 * auVar136._16_4_;
            bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar136._20_4_ = bVar6 * uVar149 | !bVar6 * auVar136._20_4_;
            bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar136._24_4_ = bVar6 * uVar150 | !bVar6 * auVar136._24_4_;
            bVar6 = SUB81(uVar87 >> 7,0);
            auVar136._28_4_ = bVar6 * uVar151 | !bVar6 * auVar136._28_4_;
            auVar105 = vblendmps_avx512vl(auVar235,auVar249);
            bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar80 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar80 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar80 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
            bVar12 = SUB81(uVar80 >> 7,0);
            auVar137._0_4_ =
                 (uint)(bVar81 & 1) *
                 ((uint)(bVar79 & 1) * auVar105._0_4_ | !(bool)(bVar79 & 1) * uVar88) |
                 !(bool)(bVar81 & 1) * auVar137._0_4_;
            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar137._4_4_ =
                 (uint)bVar86 * ((uint)bVar6 * auVar105._4_4_ | !bVar6 * uVar145) |
                 !bVar86 * auVar137._4_4_;
            bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar137._8_4_ =
                 (uint)bVar6 * ((uint)bVar7 * auVar105._8_4_ | !bVar7 * uVar146) |
                 !bVar6 * auVar137._8_4_;
            bVar6 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar137._12_4_ =
                 (uint)bVar6 * ((uint)bVar8 * auVar105._12_4_ | !bVar8 * uVar147) |
                 !bVar6 * auVar137._12_4_;
            bVar6 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar137._16_4_ =
                 (uint)bVar6 * ((uint)bVar9 * auVar105._16_4_ | !bVar9 * uVar148) |
                 !bVar6 * auVar137._16_4_;
            bVar6 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar137._20_4_ =
                 (uint)bVar6 * ((uint)bVar10 * auVar105._20_4_ | !bVar10 * uVar149) |
                 !bVar6 * auVar137._20_4_;
            bVar6 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar137._24_4_ =
                 (uint)bVar6 * ((uint)bVar11 * auVar105._24_4_ | !bVar11 * uVar150) |
                 !bVar6 * auVar137._24_4_;
            bVar6 = SUB81(uVar87 >> 7,0);
            auVar137._28_4_ =
                 (uint)bVar6 * ((uint)bVar12 * auVar105._28_4_ | !bVar12 * uVar151) |
                 !bVar6 * auVar137._28_4_;
            bVar82 = (~bVar81 | bVar79) & bVar82;
          }
        }
        auVar247._8_4_ = 0x7fffffff;
        auVar247._0_8_ = 0x7fffffff7fffffff;
        auVar247._12_4_ = 0x7fffffff;
        auVar250 = ZEXT1664(auVar247);
        auVar105 = vmulps_avx512vl(local_820,auVar106);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_800,auVar103);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_7e0,auVar109);
        _local_1c0 = _local_6c0;
        local_1a0 = vminps_avx(local_440,auVar136);
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar105,auVar226);
        _local_460 = vmaxps_avx(_local_6c0,auVar137);
        auVar165._8_4_ = 0x3e99999a;
        auVar165._0_8_ = 0x3e99999a3e99999a;
        auVar165._12_4_ = 0x3e99999a;
        auVar165._16_4_ = 0x3e99999a;
        auVar165._20_4_ = 0x3e99999a;
        auVar165._24_4_ = 0x3e99999a;
        auVar165._28_4_ = 0x3e99999a;
        uVar13 = vcmpps_avx512vl(auVar105,auVar165,1);
        local_8dc = (undefined4)uVar13;
        uVar13 = vcmpps_avx512vl(_local_6c0,local_1a0,2);
        bVar81 = (byte)uVar13 & bVar78;
        _local_540 = _local_460;
        uVar14 = vcmpps_avx512vl(_local_460,local_440,2);
        if ((bVar78 & ((byte)uVar14 | (byte)uVar13)) == 0) {
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar254 = ZEXT3264(auVar105);
        }
        else {
          auVar105 = vmulps_avx512vl(local_820,auVar243._0_32_);
          auVar105 = vfmadd213ps_avx512vl(auVar108,local_800,auVar105);
          auVar105 = vfmadd213ps_avx512vl(auVar216._0_32_,local_7e0,auVar105);
          auVar105 = vandps_avx(auVar105,auVar226);
          uVar13 = vcmpps_avx512vl(auVar105,auVar165,1);
          local_8e4 = (uint)(byte)~bVar82;
          bVar82 = (byte)uVar13 | ~bVar82;
          auVar166._8_4_ = 2;
          auVar166._0_8_ = 0x200000002;
          auVar166._12_4_ = 2;
          auVar166._16_4_ = 2;
          auVar166._20_4_ = 2;
          auVar166._24_4_ = 2;
          auVar166._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar105 = vpblendmd_avx512vl(auVar166,auVar31);
          local_420._0_4_ = (uint)(bVar82 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar82 & 1) * 2;
          bVar6 = (bool)(bVar82 >> 1 & 1);
          local_420._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar82 >> 2 & 1);
          local_420._8_4_ = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar82 >> 3 & 1);
          local_420._12_4_ = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar82 >> 4 & 1);
          local_420._16_4_ = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar82 >> 5 & 1);
          local_420._20_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar82 >> 6 & 1);
          local_420._24_4_ = (uint)bVar6 * auVar105._24_4_ | (uint)!bVar6 * 2;
          local_420._28_4_ = (uint)(bVar82 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar82 >> 7) * 2;
          local_4c0 = vpbroadcastd_avx512vl();
          uVar13 = vpcmpd_avx512vl(local_4c0,local_420,5);
          local_8e0 = (uint)bVar81;
          bVar81 = (byte)uVar13 & bVar81;
          if (bVar81 != 0) {
            auVar92 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar91 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar89 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar99 = vminps_avx(auVar92,auVar89);
            auVar92 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar89 = vmaxps_avx(auVar91,auVar92);
            auVar91 = vandps_avx(auVar247,auVar99);
            auVar92 = vandps_avx(auVar247,auVar89);
            auVar91 = vmaxps_avx(auVar91,auVar92);
            auVar92 = vmovshdup_avx(auVar91);
            auVar92 = vmaxss_avx(auVar92,auVar91);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vmaxss_avx(auVar91,auVar92);
            fVar152 = auVar91._0_4_ * 1.9073486e-06;
            local_710 = vshufps_avx(auVar89,auVar89,0xff);
            local_520 = (float)local_6c0._0_4_ + (float)local_6a0._0_4_;
            fStack_51c = (float)local_6c0._4_4_ + (float)local_6a0._4_4_;
            fStack_518 = fStack_6b8 + fStack_698;
            fStack_514 = fStack_6b4 + fStack_694;
            fStack_510 = fStack_6b0 + fStack_690;
            fStack_50c = fStack_6ac + fStack_68c;
            fStack_508 = fStack_6a8 + fStack_688;
            fStack_504 = fStack_6a4 + fStack_684;
            do {
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar167,_local_6c0);
              auVar138._0_4_ =
                   (uint)(bVar81 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar81 >> 1 & 1);
              auVar138._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar81 >> 2 & 1);
              auVar138._8_4_ = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar81 >> 3 & 1);
              auVar138._12_4_ = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar81 >> 4 & 1);
              auVar138._16_4_ = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar81 >> 5 & 1);
              auVar138._20_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar138._24_4_ =
                   (uint)(bVar81 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar81 >> 6) * 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar105 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar105 = vminps_avx(auVar138,auVar105);
              auVar103 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar103);
              auVar103 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar103);
              uVar13 = vcmpps_avx512vl(auVar138,auVar105,0);
              bVar79 = (byte)uVar13 & bVar81;
              bVar82 = bVar81;
              if (bVar79 != 0) {
                bVar82 = bVar79;
              }
              iVar16 = 0;
              for (uVar88 = (uint)bVar82; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar88 = *(uint *)(local_4e0 + (uint)(iVar16 << 2));
              uVar145 = *(uint *)(local_1c0 + (uint)(iVar16 << 2));
              fVar227 = local_8d8;
              if ((float)local_7c0._0_4_ < 0.0) {
                fVar227 = sqrtf((float)local_7c0._0_4_);
              }
              auVar243 = ZEXT464(uVar88);
              auVar240 = ZEXT464(uVar145);
              lVar85 = 4;
              do {
                fVar228 = auVar240._0_4_;
                auVar154._4_4_ = fVar228;
                auVar154._0_4_ = fVar228;
                auVar154._8_4_ = fVar228;
                auVar154._12_4_ = fVar228;
                auVar91 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_7b0);
                fVar236 = auVar243._0_4_;
                fVar204 = 1.0 - fVar236;
                auVar90 = SUB6416(ZEXT464(0x40400000),0);
                auVar93 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar242 = auVar243._0_16_;
                auVar89 = vfmadd213ss_fma(auVar90,auVar242,auVar93);
                auVar92 = vfmadd213ss_fma(auVar89,ZEXT416((uint)(fVar236 * fVar236)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar99 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar204),auVar93);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)(fVar204 * fVar204)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar229 = fVar204 * fVar204 * -fVar236 * 0.5;
                fVar232 = auVar92._0_4_ * 0.5;
                fVar230 = auVar99._0_4_ * 0.5;
                fVar231 = fVar236 * fVar236 * -fVar204 * 0.5;
                auVar206._0_4_ = fVar231 * (float)local_7a0._0_4_;
                auVar206._4_4_ = fVar231 * (float)local_7a0._4_4_;
                auVar206._8_4_ = fVar231 * fStack_798;
                auVar206._12_4_ = fVar231 * fStack_794;
                auVar217._4_4_ = fVar230;
                auVar217._0_4_ = fVar230;
                auVar217._8_4_ = fVar230;
                auVar217._12_4_ = fVar230;
                auVar92 = vfmadd132ps_fma(auVar217,auVar206,local_760._0_16_);
                auVar191._4_4_ = fVar232;
                auVar191._0_4_ = fVar232;
                auVar191._8_4_ = fVar232;
                auVar191._12_4_ = fVar232;
                auVar92 = vfmadd132ps_fma(auVar191,auVar92,local_780._0_16_);
                auVar207._4_4_ = fVar229;
                auVar207._0_4_ = fVar229;
                auVar207._8_4_ = fVar229;
                auVar207._12_4_ = fVar229;
                auVar92 = vfmadd132ps_fma(auVar207,auVar92,local_740._0_16_);
                auVar99 = vfmadd231ss_fma(auVar93,auVar242,ZEXT416(0x41100000));
                local_660._0_16_ = auVar99;
                auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar242,
                                          ZEXT416(0x40800000));
                local_680._0_16_ = auVar99;
                local_6d0 = vfmadd213ss_fma(auVar90,auVar242,ZEXT416(0xbf800000));
                local_640._0_16_ = auVar92;
                auVar92 = vsubps_avx(auVar91,auVar92);
                auVar91 = vdpps_avx(auVar92,auVar92,0x7f);
                fVar229 = auVar91._0_4_;
                if (fVar229 < 0.0) {
                  local_880._0_4_ = auVar89._0_4_;
                  local_8a0._0_16_ = ZEXT416((uint)fVar204);
                  auVar240._0_4_ = sqrtf(fVar229);
                  auVar240._4_60_ = extraout_var;
                  auVar89 = ZEXT416((uint)local_880._0_4_);
                  auVar99 = auVar240._0_16_;
                  auVar93 = local_8a0._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar91,auVar91);
                  auVar93 = ZEXT416((uint)fVar204);
                }
                fVar232 = auVar93._0_4_;
                auVar94 = vfnmadd231ss_fma(ZEXT416((uint)(fVar236 * (fVar232 + fVar232))),auVar93,
                                           auVar93);
                auVar89 = vfmadd213ss_fma(auVar89,ZEXT416((uint)(fVar236 + fVar236)),
                                          ZEXT416((uint)(fVar236 * fVar236 * 3.0)));
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar242,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar232 * -3.0)),
                                          ZEXT416((uint)(fVar232 + fVar232)),auVar93);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)(fVar204 * -2.0)),auVar242,
                                          ZEXT416((uint)(fVar236 * fVar236)));
                fVar232 = auVar94._0_4_ * 0.5;
                fVar230 = auVar89._0_4_ * 0.5;
                fVar231 = auVar90._0_4_ * 0.5;
                fVar204 = auVar93._0_4_ * 0.5;
                auVar208._0_4_ = fVar204 * (float)local_7a0._0_4_;
                auVar208._4_4_ = fVar204 * (float)local_7a0._4_4_;
                auVar208._8_4_ = fVar204 * fStack_798;
                auVar208._12_4_ = fVar204 * fStack_794;
                auVar192._4_4_ = fVar231;
                auVar192._0_4_ = fVar231;
                auVar192._8_4_ = fVar231;
                auVar192._12_4_ = fVar231;
                auVar89 = vfmadd132ps_fma(auVar192,auVar208,local_760._0_16_);
                auVar172._4_4_ = fVar230;
                auVar172._0_4_ = fVar230;
                auVar172._8_4_ = fVar230;
                auVar172._12_4_ = fVar230;
                auVar89 = vfmadd132ps_fma(auVar172,auVar89,local_780._0_16_);
                auVar252._4_4_ = fVar232;
                auVar252._0_4_ = fVar232;
                auVar252._8_4_ = fVar232;
                auVar252._12_4_ = fVar232;
                local_880._0_16_ = vfmadd132ps_fma(auVar252,auVar89,local_740._0_16_);
                auVar89 = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
                auVar61._12_4_ = 0;
                auVar61._0_12_ = ZEXT812(0);
                fVar232 = auVar89._0_4_;
                auVar93 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar232));
                fVar230 = auVar93._0_4_;
                auVar90 = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar232));
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar94 = vxorps_avx512vl(auVar89,auVar17);
                auVar93 = vfnmadd213ss_fma(auVar90,auVar89,SUB6416(ZEXT464(0x40000000),0));
                local_8a0._0_4_ = auVar99._0_4_;
                if (fVar232 < auVar94._0_4_) {
                  auVar243._0_4_ = sqrtf(fVar232);
                  auVar243._4_60_ = extraout_var_00;
                  auVar99 = ZEXT416((uint)local_8a0._0_4_);
                  auVar94 = auVar243._0_16_;
                  auVar89 = local_880._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx512f(auVar89,auVar89);
                  auVar89 = local_880._0_16_;
                }
                fVar230 = fVar230 * 1.5 + fVar232 * -0.5 * fVar230 * fVar230 * fVar230;
                auVar155._0_4_ = auVar89._0_4_ * fVar230;
                auVar155._4_4_ = auVar89._4_4_ * fVar230;
                auVar155._8_4_ = auVar89._8_4_ * fVar230;
                auVar155._12_4_ = auVar89._12_4_ * fVar230;
                auVar1 = vdpps_avx(auVar92,auVar155,0x7f);
                fVar233 = auVar99._0_4_;
                fVar231 = auVar1._0_4_;
                auVar156._0_4_ = fVar231 * fVar231;
                auVar156._4_4_ = auVar1._4_4_ * auVar1._4_4_;
                auVar156._8_4_ = auVar1._8_4_ * auVar1._8_4_;
                auVar156._12_4_ = auVar1._12_4_ * auVar1._12_4_;
                auVar95 = vsubps_avx512vl(auVar91,auVar156);
                fVar204 = auVar95._0_4_;
                auVar173._4_12_ = ZEXT812(0) << 0x20;
                auVar173._0_4_ = fVar204;
                auVar96 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
                auVar97 = vmulss_avx512f(auVar96,ZEXT416(0x3fc00000));
                auVar98 = vmulss_avx512f(auVar95,ZEXT416(0xbf000000));
                if (fVar204 < 0.0) {
                  local_6f0 = fVar230;
                  fStack_6ec = fVar230;
                  fStack_6e8 = fVar230;
                  fStack_6e4 = fVar230;
                  local_6e0 = auVar96;
                  fVar204 = sqrtf(fVar204);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar97 = ZEXT416(auVar97._0_4_);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar99 = ZEXT416((uint)local_8a0._0_4_);
                  auVar89 = local_880._0_16_;
                  auVar96 = local_6e0;
                  fVar230 = local_6f0;
                  fVar237 = fStack_6ec;
                  fVar238 = fStack_6e8;
                  fVar241 = fStack_6e4;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  fVar204 = auVar95._0_4_;
                  fVar237 = fVar230;
                  fVar238 = fVar230;
                  fVar241 = fVar230;
                }
                auVar248._8_4_ = 0x7fffffff;
                auVar248._0_8_ = 0x7fffffff7fffffff;
                auVar248._12_4_ = 0x7fffffff;
                auVar250 = ZEXT1664(auVar248);
                auVar256 = ZEXT3264(local_7e0);
                auVar257 = ZEXT3264(local_800);
                auVar255 = ZEXT3264(local_820);
                auVar174._0_4_ = (float)local_6d0._0_4_ * (float)local_7a0._0_4_;
                auVar174._4_4_ = (float)local_6d0._0_4_ * (float)local_7a0._4_4_;
                auVar174._8_4_ = (float)local_6d0._0_4_ * fStack_798;
                auVar174._12_4_ = (float)local_6d0._0_4_ * fStack_794;
                auVar193._4_4_ = local_680._0_4_;
                auVar193._0_4_ = local_680._0_4_;
                auVar193._8_4_ = local_680._0_4_;
                auVar193._12_4_ = local_680._0_4_;
                auVar95 = vfmadd132ps_fma(auVar193,auVar174,local_760._0_16_);
                auVar175._4_4_ = local_660._0_4_;
                auVar175._0_4_ = local_660._0_4_;
                auVar175._8_4_ = local_660._0_4_;
                auVar175._12_4_ = local_660._0_4_;
                auVar95 = vfmadd132ps_fma(auVar175,auVar95,local_780._0_16_);
                auVar242 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar242,
                                           ZEXT416(0x40000000));
                auVar194._0_4_ = auVar242._0_4_;
                auVar194._4_4_ = auVar194._0_4_;
                auVar194._8_4_ = auVar194._0_4_;
                auVar194._12_4_ = auVar194._0_4_;
                auVar242 = vfmadd132ps_fma(auVar194,auVar95,local_740._0_16_);
                auVar176._0_4_ = auVar242._0_4_ * fVar232;
                auVar176._4_4_ = auVar242._4_4_ * fVar232;
                auVar176._8_4_ = auVar242._8_4_ * fVar232;
                auVar176._12_4_ = auVar242._12_4_ * fVar232;
                auVar242 = vdpps_avx(auVar89,auVar242,0x7f);
                fVar232 = auVar242._0_4_;
                auVar195._0_4_ = auVar89._0_4_ * fVar232;
                auVar195._4_4_ = auVar89._4_4_ * fVar232;
                auVar195._8_4_ = auVar89._8_4_ * fVar232;
                auVar195._12_4_ = auVar89._12_4_ * fVar232;
                auVar242 = vsubps_avx(auVar176,auVar195);
                local_920 = auVar90._0_4_;
                local_920 = auVar93._0_4_ * local_920;
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar140._16_16_ = local_820._16_16_;
                auVar95 = vxorps_avx512vl(auVar89,auVar18);
                auVar218._0_4_ = fVar230 * auVar242._0_4_ * local_920;
                auVar218._4_4_ = fVar237 * auVar242._4_4_ * local_920;
                auVar218._8_4_ = fVar238 * auVar242._8_4_ * local_920;
                auVar218._12_4_ = fVar241 * auVar242._12_4_ * local_920;
                auVar93 = vdpps_avx(auVar95,auVar155,0x7f);
                auVar242 = vmaxss_avx(ZEXT416((uint)fVar152),
                                      ZEXT416((uint)(fVar228 * fVar227 * 1.9073486e-06)));
                auVar94 = vdivss_avx512f(ZEXT416((uint)fVar152),auVar94);
                auVar90 = vdpps_avx(auVar92,auVar218,0x7f);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar152),auVar242);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar233 + 1.0)),auVar94,auVar99);
                auVar99 = vdpps_avx(local_7b0,auVar155,0x7f);
                fVar232 = auVar93._0_4_ + auVar90._0_4_;
                auVar93 = vdpps_avx(auVar92,auVar95,0x7f);
                auVar95 = vmulss_avx512f(auVar98,auVar96);
                auVar96 = vmulss_avx512f(auVar96,auVar96);
                auVar90 = vdpps_avx(auVar92,local_7b0,0x7f);
                auVar97 = vaddss_avx512f(auVar97,ZEXT416((uint)(auVar95._0_4_ * auVar96._0_4_)));
                auVar96 = vfnmadd231ss_fma(auVar93,auVar1,ZEXT416((uint)fVar232));
                auVar95 = vfnmadd231ss_fma(auVar90,auVar1,auVar99);
                auVar93 = vpermilps_avx(local_640._0_16_,0xff);
                fVar204 = fVar204 - auVar93._0_4_;
                auVar93 = vshufps_avx(auVar89,auVar89,0xff);
                auVar90 = vfmsub213ss_fma(auVar96,auVar97,auVar93);
                fVar230 = auVar95._0_4_ * auVar97._0_4_;
                auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar90._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar230));
                fVar233 = auVar96._0_4_;
                fVar236 = fVar236 - (fVar231 * (fVar230 / fVar233) -
                                    fVar204 * (auVar99._0_4_ / fVar233));
                auVar243 = ZEXT464((uint)fVar236);
                fVar228 = fVar228 - (fVar204 * (fVar232 / fVar233) -
                                    fVar231 * (auVar90._0_4_ / fVar233));
                auVar240 = ZEXT464((uint)fVar228);
                auVar99 = vandps_avx(auVar1,auVar248);
                if (auVar94._0_4_ <= auVar99._0_4_) {
LAB_01dab606:
                  bVar6 = false;
                }
                else {
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar242._0_4_)),
                                            local_710,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar248,ZEXT416((uint)fVar204));
                  if (auVar90._0_4_ <= auVar99._0_4_) goto LAB_01dab606;
                  fVar228 = fVar228 + (float)local_700._0_4_;
                  auVar240 = ZEXT464((uint)fVar228);
                  bVar6 = true;
                  if ((((fVar205 <= fVar228) &&
                       (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar228 <= fVar232)) &&
                      (0.0 <= fVar236)) && (fVar236 <= 1.0)) {
                    auVar140._0_16_ = ZEXT816(0) << 0x20;
                    auVar139._4_28_ = auVar140._4_28_;
                    auVar139._0_4_ = fVar229;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar139._0_16_);
                    fVar229 = auVar99._0_4_;
                    auVar91 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar84].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar229 = fVar229 * 1.5 + auVar91._0_4_ * fVar229 * fVar229 * fVar229;
                      auVar177._0_4_ = auVar92._0_4_ * fVar229;
                      auVar177._4_4_ = auVar92._4_4_ * fVar229;
                      auVar177._8_4_ = auVar92._8_4_ * fVar229;
                      auVar177._12_4_ = auVar92._12_4_ * fVar229;
                      auVar99 = vfmadd213ps_fma(auVar93,auVar177,auVar89);
                      auVar91 = vshufps_avx(auVar177,auVar177,0xc9);
                      auVar92 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar178._0_4_ = auVar177._0_4_ * auVar92._0_4_;
                      auVar178._4_4_ = auVar177._4_4_ * auVar92._4_4_;
                      auVar178._8_4_ = auVar177._8_4_ * auVar92._8_4_;
                      auVar178._12_4_ = auVar177._12_4_ * auVar92._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar178,auVar89,auVar91);
                      auVar91 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar92 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar157._0_4_ = auVar99._0_4_ * auVar89._0_4_;
                      auVar157._4_4_ = auVar99._4_4_ * auVar89._4_4_;
                      auVar157._8_4_ = auVar99._8_4_ * auVar89._8_4_;
                      auVar157._12_4_ = auVar99._12_4_ * auVar89._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar157,auVar91,auVar92);
                      uVar153 = auVar91._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar228;
                        uVar3 = vextractps_avx(auVar91,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar91,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar153;
                        *(float *)(ray + k * 4 + 0xf0) = fVar236;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8f0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar84;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar91,auVar91,0x55);
                        auStack_5d0 = vshufps_avx(auVar91,auVar91,0xaa);
                        local_5c0 = uVar153;
                        uStack_5bc = uVar153;
                        uStack_5b8 = uVar153;
                        uStack_5b4 = uVar153;
                        local_5b0 = fVar236;
                        fStack_5ac = fVar236;
                        fStack_5a8 = fVar236;
                        fStack_5a4 = fVar236;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar228;
                        local_900 = local_610._0_8_;
                        uStack_8f8 = local_610._8_8_;
                        local_8d0.valid = (int *)&local_900;
                        local_8d0.geometryUserPtr = pGVar4->userPtr;
                        local_8d0.context = context->user;
                        local_8d0.hit = local_5e0;
                        local_8d0.N = 4;
                        local_8d0.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_8d0);
                          auVar240 = ZEXT1664(ZEXT416((uint)fVar228));
                          auVar243 = ZEXT1664(ZEXT416((uint)fVar236));
                          auVar255 = ZEXT3264(local_820);
                          auVar257 = ZEXT3264(local_800);
                          auVar256 = ZEXT3264(local_7e0);
                          auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar66._8_8_ = uStack_8f8;
                        auVar66._0_8_ = local_900;
                        uVar87 = vptestmd_avx512vl(auVar66,auVar66);
                        if ((uVar87 & 0xf) != 0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_8d0);
                            auVar240 = ZEXT1664(ZEXT416((uint)fVar228));
                            auVar243 = ZEXT1664(ZEXT416((uint)fVar236));
                            auVar255 = ZEXT3264(local_820);
                            auVar257 = ZEXT3264(local_800);
                            auVar256 = ZEXT3264(local_7e0);
                            auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar67._8_8_ = uStack_8f8;
                          auVar67._0_8_ = local_900;
                          uVar87 = vptestmd_avx512vl(auVar67,auVar67);
                          uVar87 = uVar87 & 0xf;
                          bVar82 = (byte)uVar87;
                          if (bVar82 != 0) {
                            iVar63 = *(int *)(local_8d0.hit + 4);
                            iVar64 = *(int *)(local_8d0.hit + 8);
                            iVar65 = *(int *)(local_8d0.hit + 0xc);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xc0) =
                                 (uint)(bVar82 & 1) * *(int *)local_8d0.hit |
                                 (uint)!(bool)(bVar82 & 1) * *(int *)(local_8d0.ray + 0xc0);
                            *(uint *)(local_8d0.ray + 0xc4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xc4);
                            *(uint *)(local_8d0.ray + 200) =
                                 (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_8d0.ray + 200)
                            ;
                            *(uint *)(local_8d0.ray + 0xcc) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xcc);
                            iVar63 = *(int *)(local_8d0.hit + 0x14);
                            iVar64 = *(int *)(local_8d0.hit + 0x18);
                            iVar65 = *(int *)(local_8d0.hit + 0x1c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xd0) =
                                 (uint)(bVar82 & 1) * *(int *)(local_8d0.hit + 0x10) |
                                 (uint)!(bool)(bVar82 & 1) * *(int *)(local_8d0.ray + 0xd0);
                            *(uint *)(local_8d0.ray + 0xd4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xd4);
                            *(uint *)(local_8d0.ray + 0xd8) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0xd8);
                            *(uint *)(local_8d0.ray + 0xdc) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xdc);
                            iVar63 = *(int *)(local_8d0.hit + 0x24);
                            iVar64 = *(int *)(local_8d0.hit + 0x28);
                            iVar65 = *(int *)(local_8d0.hit + 0x2c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xe0) =
                                 (uint)(bVar82 & 1) * *(int *)(local_8d0.hit + 0x20) |
                                 (uint)!(bool)(bVar82 & 1) * *(int *)(local_8d0.ray + 0xe0);
                            *(uint *)(local_8d0.ray + 0xe4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xe4);
                            *(uint *)(local_8d0.ray + 0xe8) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0xe8);
                            *(uint *)(local_8d0.ray + 0xec) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xec);
                            iVar63 = *(int *)(local_8d0.hit + 0x34);
                            iVar64 = *(int *)(local_8d0.hit + 0x38);
                            iVar65 = *(int *)(local_8d0.hit + 0x3c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xf0) =
                                 (uint)(bVar82 & 1) * *(int *)(local_8d0.hit + 0x30) |
                                 (uint)!(bool)(bVar82 & 1) * *(int *)(local_8d0.ray + 0xf0);
                            *(uint *)(local_8d0.ray + 0xf4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xf4);
                            *(uint *)(local_8d0.ray + 0xf8) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0xf8);
                            *(uint *)(local_8d0.ray + 0xfc) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xfc);
                            iVar63 = *(int *)(local_8d0.hit + 0x44);
                            iVar64 = *(int *)(local_8d0.hit + 0x48);
                            iVar65 = *(int *)(local_8d0.hit + 0x4c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0x100) =
                                 (uint)(bVar82 & 1) * *(int *)(local_8d0.hit + 0x40) |
                                 (uint)!(bool)(bVar82 & 1) * *(int *)(local_8d0.ray + 0x100);
                            *(uint *)(local_8d0.ray + 0x104) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0x104);
                            *(uint *)(local_8d0.ray + 0x108) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0x108);
                            *(uint *)(local_8d0.ray + 0x10c) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0x10c);
                            auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x50));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x110) = auVar91;
                            auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x60));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x120) = auVar91;
                            auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x70));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x130) = auVar91;
                            auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x80));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x140) = auVar91;
                            goto LAB_01dab609;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar232;
                      }
                    }
                  }
                }
LAB_01dab609:
                bVar86 = lVar85 != 0;
                lVar85 = lVar85 + -1;
              } while ((!bVar6) && (bVar86));
              auVar70._4_4_ = fStack_51c;
              auVar70._0_4_ = local_520;
              auVar70._8_4_ = fStack_518;
              auVar70._12_4_ = fStack_514;
              auVar70._16_4_ = fStack_510;
              auVar70._20_4_ = fStack_50c;
              auVar70._24_4_ = fStack_508;
              auVar70._28_4_ = fStack_504;
              uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar32._4_4_ = uVar153;
              auVar32._0_4_ = uVar153;
              auVar32._8_4_ = uVar153;
              auVar32._12_4_ = uVar153;
              auVar32._16_4_ = uVar153;
              auVar32._20_4_ = uVar153;
              auVar32._24_4_ = uVar153;
              auVar32._28_4_ = uVar153;
              uVar13 = vcmpps_avx512vl(auVar70,auVar32,2);
              bVar81 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar81 & (byte)uVar13;
            } while (bVar81 != 0);
          }
          auVar168._0_4_ = (float)local_540._0_4_ + (float)local_6a0._0_4_;
          auVar168._4_4_ = (float)local_540._4_4_ + (float)local_6a0._4_4_;
          auVar168._8_4_ = fStack_538 + fStack_698;
          auVar168._12_4_ = fStack_534 + fStack_694;
          auVar168._16_4_ = fStack_530 + fStack_690;
          auVar168._20_4_ = fStack_52c + fStack_68c;
          auVar168._24_4_ = fStack_528 + fStack_688;
          auVar168._28_4_ = fStack_524 + fStack_684;
          uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar33._4_4_ = uVar153;
          auVar33._0_4_ = uVar153;
          auVar33._8_4_ = uVar153;
          auVar33._12_4_ = uVar153;
          auVar33._16_4_ = uVar153;
          auVar33._20_4_ = uVar153;
          auVar33._24_4_ = uVar153;
          auVar33._28_4_ = uVar153;
          uVar13 = vcmpps_avx512vl(auVar168,auVar33,2);
          bVar82 = (byte)local_8dc | (byte)local_8e4;
          bVar78 = (byte)uVar14 & bVar78 & (byte)uVar13;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar105 = vpblendmd_avx512vl(auVar169,auVar34);
          local_540._0_4_ = (uint)(bVar82 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar82 & 1) * 2;
          bVar6 = (bool)(bVar82 >> 1 & 1);
          local_540._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar82 >> 2 & 1);
          fStack_538 = (float)((uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar82 >> 3 & 1);
          fStack_534 = (float)((uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar82 >> 4 & 1);
          fStack_530 = (float)((uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar82 >> 5 & 1);
          fStack_52c = (float)((uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar82 >> 6 & 1);
          fStack_528 = (float)((uint)bVar6 * auVar105._24_4_ | (uint)!bVar6 * 2);
          fStack_524 = (float)((uint)(bVar82 >> 7) * auVar105._28_4_ |
                              (uint)!(bool)(bVar82 >> 7) * 2);
          uVar13 = vpcmpd_avx512vl(_local_540,local_4c0,2);
          bVar82 = (byte)uVar13 & bVar78;
          if (bVar82 != 0) {
            auVar92 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar91 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar89 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar99 = vminps_avx(auVar92,auVar89);
            auVar92 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar89 = vmaxps_avx(auVar91,auVar92);
            auVar91 = vandps_avx(auVar250._0_16_,auVar99);
            auVar92 = vandps_avx(auVar250._0_16_,auVar89);
            auVar91 = vmaxps_avx(auVar91,auVar92);
            auVar92 = vmovshdup_avx(auVar91);
            auVar92 = vmaxss_avx(auVar92,auVar91);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vmaxss_avx(auVar91,auVar92);
            fVar152 = auVar91._0_4_ * 1.9073486e-06;
            local_710 = vshufps_avx(auVar89,auVar89,0xff);
            _local_6c0 = _local_460;
            local_520 = (float)local_460._0_4_ + (float)local_6a0._0_4_;
            fStack_51c = (float)local_460._4_4_ + (float)local_6a0._4_4_;
            fStack_518 = fStack_458 + fStack_698;
            fStack_514 = fStack_454 + fStack_694;
            fStack_510 = fStack_450 + fStack_690;
            fStack_50c = fStack_44c + fStack_68c;
            fStack_508 = fStack_448 + fStack_688;
            fStack_504 = fStack_444 + fStack_684;
            do {
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar170,_local_6c0);
              auVar141._0_4_ =
                   (uint)(bVar82 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar82 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar82 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar82 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar82 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar82 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar141._24_4_ =
                   (uint)(bVar82 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar82 >> 6) * 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar105 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar105 = vminps_avx(auVar141,auVar105);
              auVar103 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar103);
              auVar103 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar103);
              uVar13 = vcmpps_avx512vl(auVar141,auVar105,0);
              bVar79 = (byte)uVar13 & bVar82;
              bVar81 = bVar82;
              if (bVar79 != 0) {
                bVar81 = bVar79;
              }
              iVar16 = 0;
              for (uVar88 = (uint)bVar81; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar88 = *(uint *)(local_500 + (uint)(iVar16 << 2));
              fVar227 = *(float *)(local_440 + (uint)(iVar16 << 2));
              fVar228 = local_8d4;
              if ((float)local_7c0._0_4_ < 0.0) {
                fVar228 = sqrtf((float)local_7c0._0_4_);
              }
              auVar243 = ZEXT464(uVar88);
              lVar85 = 4;
              do {
                auVar158._4_4_ = fVar227;
                auVar158._0_4_ = fVar227;
                auVar158._8_4_ = fVar227;
                auVar158._12_4_ = fVar227;
                auVar91 = vfmadd132ps_fma(auVar158,ZEXT816(0) << 0x40,local_7b0);
                fVar236 = auVar243._0_4_;
                fVar204 = 1.0 - fVar236;
                auVar90 = SUB6416(ZEXT464(0x40400000),0);
                auVar93 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar242 = auVar243._0_16_;
                auVar89 = vfmadd213ss_fma(auVar90,auVar242,auVar93);
                auVar92 = vfmadd213ss_fma(auVar89,ZEXT416((uint)(fVar236 * fVar236)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar99 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar204),auVar93);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)(fVar204 * fVar204)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar229 = fVar204 * fVar204 * -fVar236 * 0.5;
                fVar232 = auVar92._0_4_ * 0.5;
                fVar230 = auVar99._0_4_ * 0.5;
                fVar231 = fVar236 * fVar236 * -fVar204 * 0.5;
                auVar209._0_4_ = fVar231 * (float)local_7a0._0_4_;
                auVar209._4_4_ = fVar231 * (float)local_7a0._4_4_;
                auVar209._8_4_ = fVar231 * fStack_798;
                auVar209._12_4_ = fVar231 * fStack_794;
                auVar219._4_4_ = fVar230;
                auVar219._0_4_ = fVar230;
                auVar219._8_4_ = fVar230;
                auVar219._12_4_ = fVar230;
                auVar92 = vfmadd132ps_fma(auVar219,auVar209,local_760._0_16_);
                auVar196._4_4_ = fVar232;
                auVar196._0_4_ = fVar232;
                auVar196._8_4_ = fVar232;
                auVar196._12_4_ = fVar232;
                auVar92 = vfmadd132ps_fma(auVar196,auVar92,local_780._0_16_);
                auVar210._4_4_ = fVar229;
                auVar210._0_4_ = fVar229;
                auVar210._8_4_ = fVar229;
                auVar210._12_4_ = fVar229;
                auVar92 = vfmadd132ps_fma(auVar210,auVar92,local_740._0_16_);
                auVar99 = vfmadd231ss_fma(auVar93,auVar242,ZEXT416(0x41100000));
                local_660._0_16_ = auVar99;
                auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar242,
                                          ZEXT416(0x40800000));
                local_680._0_16_ = auVar99;
                local_6d0 = vfmadd213ss_fma(auVar90,auVar242,ZEXT416(0xbf800000));
                local_640._0_16_ = auVar92;
                auVar92 = vsubps_avx(auVar91,auVar92);
                auVar91 = vdpps_avx(auVar92,auVar92,0x7f);
                fVar229 = auVar91._0_4_;
                if (fVar229 < 0.0) {
                  local_880._0_4_ = auVar89._0_4_;
                  local_8a0._0_16_ = ZEXT416((uint)fVar204);
                  auVar250._0_4_ = sqrtf(fVar229);
                  auVar250._4_60_ = extraout_var_01;
                  auVar89 = ZEXT416((uint)local_880._0_4_);
                  auVar99 = auVar250._0_16_;
                  auVar93 = local_8a0._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar91,auVar91);
                  auVar93 = ZEXT416((uint)fVar204);
                }
                fVar232 = auVar93._0_4_;
                auVar94 = vfnmadd231ss_fma(ZEXT416((uint)(fVar236 * (fVar232 + fVar232))),auVar93,
                                           auVar93);
                auVar89 = vfmadd213ss_fma(auVar89,ZEXT416((uint)(fVar236 + fVar236)),
                                          ZEXT416((uint)(fVar236 * fVar236 * 3.0)));
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar242,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar232 * -3.0)),
                                          ZEXT416((uint)(fVar232 + fVar232)),auVar93);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)(fVar204 * -2.0)),auVar242,
                                          ZEXT416((uint)(fVar236 * fVar236)));
                fVar232 = auVar94._0_4_ * 0.5;
                fVar230 = auVar89._0_4_ * 0.5;
                fVar231 = auVar90._0_4_ * 0.5;
                fVar204 = auVar93._0_4_ * 0.5;
                auVar211._0_4_ = fVar204 * (float)local_7a0._0_4_;
                auVar211._4_4_ = fVar204 * (float)local_7a0._4_4_;
                auVar211._8_4_ = fVar204 * fStack_798;
                auVar211._12_4_ = fVar204 * fStack_794;
                auVar197._4_4_ = fVar231;
                auVar197._0_4_ = fVar231;
                auVar197._8_4_ = fVar231;
                auVar197._12_4_ = fVar231;
                auVar89 = vfmadd132ps_fma(auVar197,auVar211,local_760._0_16_);
                auVar179._4_4_ = fVar230;
                auVar179._0_4_ = fVar230;
                auVar179._8_4_ = fVar230;
                auVar179._12_4_ = fVar230;
                auVar89 = vfmadd132ps_fma(auVar179,auVar89,local_780._0_16_);
                auVar253._4_4_ = fVar232;
                auVar253._0_4_ = fVar232;
                auVar253._8_4_ = fVar232;
                auVar253._12_4_ = fVar232;
                local_880._0_16_ = vfmadd132ps_fma(auVar253,auVar89,local_740._0_16_);
                auVar89 = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
                auVar62._12_4_ = 0;
                auVar62._0_12_ = ZEXT812(0);
                fVar232 = auVar89._0_4_;
                auVar93 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar232));
                fVar230 = auVar93._0_4_;
                auVar90 = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar232));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar94 = vxorps_avx512vl(auVar89,auVar19);
                auVar93 = vfnmadd213ss_fma(auVar90,auVar89,SUB6416(ZEXT464(0x40000000),0));
                local_8a0._0_4_ = auVar99._0_4_;
                if (fVar232 < auVar94._0_4_) {
                  auVar255._0_4_ = sqrtf(fVar232);
                  auVar255._4_60_ = extraout_var_02;
                  auVar99 = ZEXT416((uint)local_8a0._0_4_);
                  auVar94 = auVar255._0_16_;
                  auVar89 = local_880._0_16_;
                }
                else {
                  auVar94 = vsqrtss_avx512f(auVar89,auVar89);
                  auVar89 = local_880._0_16_;
                }
                fVar230 = fVar230 * 1.5 + fVar232 * -0.5 * fVar230 * fVar230 * fVar230;
                auVar159._0_4_ = auVar89._0_4_ * fVar230;
                auVar159._4_4_ = auVar89._4_4_ * fVar230;
                auVar159._8_4_ = auVar89._8_4_ * fVar230;
                auVar159._12_4_ = auVar89._12_4_ * fVar230;
                auVar1 = vdpps_avx(auVar92,auVar159,0x7f);
                fVar233 = auVar99._0_4_;
                fVar231 = auVar1._0_4_;
                auVar160._0_4_ = fVar231 * fVar231;
                auVar160._4_4_ = auVar1._4_4_ * auVar1._4_4_;
                auVar160._8_4_ = auVar1._8_4_ * auVar1._8_4_;
                auVar160._12_4_ = auVar1._12_4_ * auVar1._12_4_;
                auVar95 = vsubps_avx512vl(auVar91,auVar160);
                fVar204 = auVar95._0_4_;
                auVar180._4_12_ = ZEXT812(0) << 0x20;
                auVar180._0_4_ = fVar204;
                auVar96 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
                auVar97 = vmulss_avx512f(auVar96,ZEXT416(0x3fc00000));
                auVar98 = vmulss_avx512f(auVar95,ZEXT416(0xbf000000));
                if (fVar204 < 0.0) {
                  local_6f0 = fVar230;
                  fStack_6ec = fVar230;
                  fStack_6e8 = fVar230;
                  fStack_6e4 = fVar230;
                  local_6e0 = auVar96;
                  fVar204 = sqrtf(fVar204);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar97 = ZEXT416(auVar97._0_4_);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar99 = ZEXT416((uint)local_8a0._0_4_);
                  auVar89 = local_880._0_16_;
                  auVar96 = local_6e0;
                  fVar230 = local_6f0;
                  fVar237 = fStack_6ec;
                  fVar238 = fStack_6e8;
                  fVar241 = fStack_6e4;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  fVar204 = auVar95._0_4_;
                  fVar237 = fVar230;
                  fVar238 = fVar230;
                  fVar241 = fVar230;
                }
                auVar250 = ZEXT1664(auVar92);
                auVar239._8_4_ = 0x7fffffff;
                auVar239._0_8_ = 0x7fffffff7fffffff;
                auVar239._12_4_ = 0x7fffffff;
                auVar240 = ZEXT1664(auVar239);
                auVar256 = ZEXT3264(local_7e0);
                auVar257 = ZEXT3264(local_800);
                auVar255 = ZEXT3264(local_820);
                auVar181._0_4_ = (float)local_6d0._0_4_ * (float)local_7a0._0_4_;
                auVar181._4_4_ = (float)local_6d0._0_4_ * (float)local_7a0._4_4_;
                auVar181._8_4_ = (float)local_6d0._0_4_ * fStack_798;
                auVar181._12_4_ = (float)local_6d0._0_4_ * fStack_794;
                auVar198._4_4_ = local_680._0_4_;
                auVar198._0_4_ = local_680._0_4_;
                auVar198._8_4_ = local_680._0_4_;
                auVar198._12_4_ = local_680._0_4_;
                auVar95 = vfmadd132ps_fma(auVar198,auVar181,local_760._0_16_);
                auVar182._4_4_ = local_660._0_4_;
                auVar182._0_4_ = local_660._0_4_;
                auVar182._8_4_ = local_660._0_4_;
                auVar182._12_4_ = local_660._0_4_;
                auVar95 = vfmadd132ps_fma(auVar182,auVar95,local_780._0_16_);
                auVar242 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar242,
                                           ZEXT416(0x40000000));
                auVar199._0_4_ = auVar242._0_4_;
                auVar199._4_4_ = auVar199._0_4_;
                auVar199._8_4_ = auVar199._0_4_;
                auVar199._12_4_ = auVar199._0_4_;
                auVar242 = vfmadd132ps_fma(auVar199,auVar95,local_740._0_16_);
                auVar183._0_4_ = auVar242._0_4_ * fVar232;
                auVar183._4_4_ = auVar242._4_4_ * fVar232;
                auVar183._8_4_ = auVar242._8_4_ * fVar232;
                auVar183._12_4_ = auVar242._12_4_ * fVar232;
                auVar242 = vdpps_avx(auVar89,auVar242,0x7f);
                fVar232 = auVar242._0_4_;
                auVar200._0_4_ = auVar89._0_4_ * fVar232;
                auVar200._4_4_ = auVar89._4_4_ * fVar232;
                auVar200._8_4_ = auVar89._8_4_ * fVar232;
                auVar200._12_4_ = auVar89._12_4_ * fVar232;
                auVar242 = vsubps_avx(auVar183,auVar200);
                local_920 = auVar90._0_4_;
                local_920 = auVar93._0_4_ * local_920;
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar143._16_16_ = local_820._16_16_;
                auVar95 = vxorps_avx512vl(auVar89,auVar20);
                auVar220._0_4_ = fVar230 * auVar242._0_4_ * local_920;
                auVar220._4_4_ = fVar237 * auVar242._4_4_ * local_920;
                auVar220._8_4_ = fVar238 * auVar242._8_4_ * local_920;
                auVar220._12_4_ = fVar241 * auVar242._12_4_ * local_920;
                auVar93 = vdpps_avx(auVar95,auVar159,0x7f);
                auVar242 = vmaxss_avx(ZEXT416((uint)fVar152),
                                      ZEXT416((uint)(fVar227 * fVar228 * 1.9073486e-06)));
                auVar94 = vdivss_avx512f(ZEXT416((uint)fVar152),auVar94);
                auVar90 = vdpps_avx(auVar92,auVar220,0x7f);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar152),auVar242);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar233 + 1.0)),auVar94,auVar99);
                auVar99 = vdpps_avx(local_7b0,auVar159,0x7f);
                fVar232 = auVar93._0_4_ + auVar90._0_4_;
                auVar93 = vdpps_avx(auVar92,auVar95,0x7f);
                auVar95 = vmulss_avx512f(auVar98,auVar96);
                auVar96 = vmulss_avx512f(auVar96,auVar96);
                auVar90 = vdpps_avx(auVar92,local_7b0,0x7f);
                auVar97 = vaddss_avx512f(auVar97,ZEXT416((uint)(auVar95._0_4_ * auVar96._0_4_)));
                auVar96 = vfnmadd231ss_fma(auVar93,auVar1,ZEXT416((uint)fVar232));
                auVar95 = vfnmadd231ss_fma(auVar90,auVar1,auVar99);
                auVar93 = vpermilps_avx(local_640._0_16_,0xff);
                fVar204 = fVar204 - auVar93._0_4_;
                auVar93 = vshufps_avx(auVar89,auVar89,0xff);
                auVar90 = vfmsub213ss_fma(auVar96,auVar97,auVar93);
                fVar230 = auVar95._0_4_ * auVar97._0_4_;
                auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar90._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar230));
                fVar233 = auVar96._0_4_;
                fVar236 = fVar236 - (fVar231 * (fVar230 / fVar233) -
                                    fVar204 * (auVar99._0_4_ / fVar233));
                auVar243 = ZEXT464((uint)fVar236);
                fVar227 = fVar227 - (fVar204 * (fVar232 / fVar233) -
                                    fVar231 * (auVar90._0_4_ / fVar233));
                auVar99 = vandps_avx(auVar1,auVar239);
                if (auVar94._0_4_ <= auVar99._0_4_) {
LAB_01dac279:
                  bVar6 = false;
                }
                else {
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar242._0_4_)),
                                            local_710,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar239,ZEXT416((uint)fVar204));
                  if (auVar90._0_4_ <= auVar99._0_4_) goto LAB_01dac279;
                  fVar227 = fVar227 + (float)local_700._0_4_;
                  bVar6 = true;
                  if ((((fVar205 <= fVar227) &&
                       (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar227 <= fVar232)) &&
                      (0.0 <= fVar236)) && (fVar236 <= 1.0)) {
                    auVar143._0_16_ = ZEXT816(0) << 0x20;
                    auVar142._4_28_ = auVar143._4_28_;
                    auVar142._0_4_ = fVar229;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar142._0_16_);
                    fVar229 = auVar99._0_4_;
                    auVar91 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar84].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar229 = fVar229 * 1.5 + auVar91._0_4_ * fVar229 * fVar229 * fVar229;
                      auVar184._0_4_ = auVar92._0_4_ * fVar229;
                      auVar184._4_4_ = auVar92._4_4_ * fVar229;
                      auVar184._8_4_ = auVar92._8_4_ * fVar229;
                      auVar184._12_4_ = auVar92._12_4_ * fVar229;
                      auVar93 = vfmadd213ps_fma(auVar93,auVar184,auVar89);
                      auVar91 = vshufps_avx(auVar184,auVar184,0xc9);
                      auVar99 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar185._0_4_ = auVar184._0_4_ * auVar99._0_4_;
                      auVar185._4_4_ = auVar184._4_4_ * auVar99._4_4_;
                      auVar185._8_4_ = auVar184._8_4_ * auVar99._8_4_;
                      auVar185._12_4_ = auVar184._12_4_ * auVar99._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar185,auVar89,auVar91);
                      auVar91 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar89 = vshufps_avx(auVar93,auVar93,0xc9);
                      auVar99 = vshufps_avx(auVar99,auVar99,0xd2);
                      auVar161._0_4_ = auVar93._0_4_ * auVar99._0_4_;
                      auVar161._4_4_ = auVar93._4_4_ * auVar99._4_4_;
                      auVar161._8_4_ = auVar93._8_4_ * auVar99._8_4_;
                      auVar161._12_4_ = auVar93._12_4_ * auVar99._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar161,auVar91,auVar89);
                      uVar153 = auVar91._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar227;
                        uVar3 = vextractps_avx(auVar91,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar91,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar153;
                        *(float *)(ray + k * 4 + 0xf0) = fVar236;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8f0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar84;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar91,auVar91,0x55);
                        auStack_5d0 = vshufps_avx(auVar91,auVar91,0xaa);
                        local_5c0 = uVar153;
                        uStack_5bc = uVar153;
                        uStack_5b8 = uVar153;
                        uStack_5b4 = uVar153;
                        local_5b0 = fVar236;
                        fStack_5ac = fVar236;
                        fStack_5a8 = fVar236;
                        fStack_5a4 = fVar236;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar227;
                        local_900 = local_610._0_8_;
                        uStack_8f8 = local_610._8_8_;
                        local_8d0.valid = (int *)&local_900;
                        local_8d0.geometryUserPtr = pGVar4->userPtr;
                        local_8d0.context = context->user;
                        local_8d0.hit = local_5e0;
                        local_8d0.N = 4;
                        local_8d0.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar240 = ZEXT1664(auVar239);
                          auVar250 = ZEXT1664(auVar92);
                          (*pGVar4->intersectionFilterN)(&local_8d0);
                          auVar243 = ZEXT1664(ZEXT416((uint)fVar236));
                          auVar255 = ZEXT3264(local_820);
                          auVar257 = ZEXT3264(local_800);
                          auVar256 = ZEXT3264(local_7e0);
                        }
                        auVar68._8_8_ = uStack_8f8;
                        auVar68._0_8_ = local_900;
                        uVar87 = vptestmd_avx512vl(auVar68,auVar68);
                        if ((uVar87 & 0xf) != 0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            (*p_Var5)(&local_8d0);
                            auVar243 = ZEXT1664(ZEXT416((uint)fVar236));
                            auVar255 = ZEXT3264(local_820);
                            auVar257 = ZEXT3264(local_800);
                            auVar256 = ZEXT3264(local_7e0);
                          }
                          auVar69._8_8_ = uStack_8f8;
                          auVar69._0_8_ = local_900;
                          uVar87 = vptestmd_avx512vl(auVar69,auVar69);
                          uVar87 = uVar87 & 0xf;
                          bVar81 = (byte)uVar87;
                          if (bVar81 != 0) {
                            iVar63 = *(int *)(local_8d0.hit + 4);
                            iVar64 = *(int *)(local_8d0.hit + 8);
                            iVar65 = *(int *)(local_8d0.hit + 0xc);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xc0) =
                                 (uint)(bVar81 & 1) * *(int *)local_8d0.hit |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_8d0.ray + 0xc0);
                            *(uint *)(local_8d0.ray + 0xc4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xc4);
                            *(uint *)(local_8d0.ray + 200) =
                                 (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_8d0.ray + 200)
                            ;
                            *(uint *)(local_8d0.ray + 0xcc) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xcc);
                            iVar63 = *(int *)(local_8d0.hit + 0x14);
                            iVar64 = *(int *)(local_8d0.hit + 0x18);
                            iVar65 = *(int *)(local_8d0.hit + 0x1c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xd0) =
                                 (uint)(bVar81 & 1) * *(int *)(local_8d0.hit + 0x10) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_8d0.ray + 0xd0);
                            *(uint *)(local_8d0.ray + 0xd4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xd4);
                            *(uint *)(local_8d0.ray + 0xd8) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0xd8);
                            *(uint *)(local_8d0.ray + 0xdc) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xdc);
                            iVar63 = *(int *)(local_8d0.hit + 0x24);
                            iVar64 = *(int *)(local_8d0.hit + 0x28);
                            iVar65 = *(int *)(local_8d0.hit + 0x2c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xe0) =
                                 (uint)(bVar81 & 1) * *(int *)(local_8d0.hit + 0x20) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_8d0.ray + 0xe0);
                            *(uint *)(local_8d0.ray + 0xe4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xe4);
                            *(uint *)(local_8d0.ray + 0xe8) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0xe8);
                            *(uint *)(local_8d0.ray + 0xec) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xec);
                            iVar63 = *(int *)(local_8d0.hit + 0x34);
                            iVar64 = *(int *)(local_8d0.hit + 0x38);
                            iVar65 = *(int *)(local_8d0.hit + 0x3c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xf0) =
                                 (uint)(bVar81 & 1) * *(int *)(local_8d0.hit + 0x30) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_8d0.ray + 0xf0);
                            *(uint *)(local_8d0.ray + 0xf4) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0xf4);
                            *(uint *)(local_8d0.ray + 0xf8) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0xf8);
                            *(uint *)(local_8d0.ray + 0xfc) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0xfc);
                            iVar63 = *(int *)(local_8d0.hit + 0x44);
                            iVar64 = *(int *)(local_8d0.hit + 0x48);
                            iVar65 = *(int *)(local_8d0.hit + 0x4c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar8 = SUB81(uVar87 >> 3,0);
                            *(uint *)(local_8d0.ray + 0x100) =
                                 (uint)(bVar81 & 1) * *(int *)(local_8d0.hit + 0x40) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_8d0.ray + 0x100);
                            *(uint *)(local_8d0.ray + 0x104) =
                                 (uint)bVar86 * iVar63 |
                                 (uint)!bVar86 * *(int *)(local_8d0.ray + 0x104);
                            *(uint *)(local_8d0.ray + 0x108) =
                                 (uint)bVar7 * iVar64 |
                                 (uint)!bVar7 * *(int *)(local_8d0.ray + 0x108);
                            *(uint *)(local_8d0.ray + 0x10c) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_8d0.ray + 0x10c);
                            auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x50));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x110) = auVar91;
                            auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x60));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x120) = auVar91;
                            auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x70));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x130) = auVar91;
                            auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x80));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x140) = auVar91;
                            goto LAB_01dac27c;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar232;
                      }
                    }
                  }
                }
LAB_01dac27c:
                bVar86 = lVar85 != 0;
                lVar85 = lVar85 + -1;
              } while ((!bVar6) && (bVar86));
              auVar71._4_4_ = fStack_51c;
              auVar71._0_4_ = local_520;
              auVar71._8_4_ = fStack_518;
              auVar71._12_4_ = fStack_514;
              auVar71._16_4_ = fStack_510;
              auVar71._20_4_ = fStack_50c;
              auVar71._24_4_ = fStack_508;
              auVar71._28_4_ = fStack_504;
              uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar35._4_4_ = uVar153;
              auVar35._0_4_ = uVar153;
              auVar35._8_4_ = uVar153;
              auVar35._12_4_ = uVar153;
              auVar35._16_4_ = uVar153;
              auVar35._20_4_ = uVar153;
              auVar35._24_4_ = uVar153;
              auVar35._28_4_ = uVar153;
              uVar13 = vcmpps_avx512vl(auVar71,auVar35,2);
              bVar82 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar82 & (byte)uVar13;
            } while (bVar82 != 0);
          }
          uVar14 = vpcmpd_avx512vl(local_4c0,_local_540,1);
          uVar15 = vpcmpd_avx512vl(local_4c0,local_420,1);
          auVar187._0_4_ = (float)local_6a0._0_4_ + (float)local_1c0._0_4_;
          auVar187._4_4_ = (float)local_6a0._4_4_ + (float)local_1c0._4_4_;
          auVar187._8_4_ = fStack_698 + fStack_1b8;
          auVar187._12_4_ = fStack_694 + fStack_1b4;
          auVar187._16_4_ = fStack_690 + fStack_1b0;
          auVar187._20_4_ = fStack_68c + fStack_1ac;
          auVar187._24_4_ = fStack_688 + fStack_1a8;
          auVar187._28_4_ = fStack_684 + fStack_1a4;
          uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar202._4_4_ = uVar153;
          auVar202._0_4_ = uVar153;
          auVar202._8_4_ = uVar153;
          auVar202._12_4_ = uVar153;
          auVar202._16_4_ = uVar153;
          auVar202._20_4_ = uVar153;
          auVar202._24_4_ = uVar153;
          auVar202._28_4_ = uVar153;
          uVar13 = vcmpps_avx512vl(auVar187,auVar202,2);
          bVar82 = (byte)local_8e0 & (byte)uVar15 & (byte)uVar13;
          auVar215._0_4_ = (float)local_6a0._0_4_ + (float)local_460._0_4_;
          auVar215._4_4_ = (float)local_6a0._4_4_ + (float)local_460._4_4_;
          auVar215._8_4_ = fStack_698 + fStack_458;
          auVar215._12_4_ = fStack_694 + fStack_454;
          auVar215._16_4_ = fStack_690 + fStack_450;
          auVar215._20_4_ = fStack_68c + fStack_44c;
          auVar215._24_4_ = fStack_688 + fStack_448;
          auVar215._28_4_ = fStack_684 + fStack_444;
          auVar216 = ZEXT3264(auVar215);
          uVar13 = vcmpps_avx512vl(auVar215,auVar202,2);
          bVar78 = bVar78 & (byte)uVar14 & (byte)uVar13 | bVar82;
          prim = local_840;
          if (bVar78 == 0) {
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar254 = ZEXT3264(auVar105);
          }
          else {
            uVar87 = local_830 & 0xffffffff;
            abStack_180[uVar87 * 0x60] = bVar78;
            bVar6 = (bool)(bVar82 >> 1 & 1);
            bVar86 = (bool)(bVar82 >> 2 & 1);
            bVar7 = (bool)(bVar82 >> 3 & 1);
            bVar8 = (bool)(bVar82 >> 4 & 1);
            bVar9 = (bool)(bVar82 >> 5 & 1);
            bVar10 = (bool)(bVar82 >> 6 & 1);
            auStack_160[uVar87 * 0x18] =
                 (uint)(bVar82 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar82 & 1) * local_460._0_4_;
            auStack_160[uVar87 * 0x18 + 1] =
                 (uint)bVar6 * local_1c0._4_4_ | (uint)!bVar6 * local_460._4_4_;
            auStack_160[uVar87 * 0x18 + 2] =
                 (uint)bVar86 * (int)fStack_1b8 | (uint)!bVar86 * (int)fStack_458;
            auStack_160[uVar87 * 0x18 + 3] =
                 (uint)bVar7 * (int)fStack_1b4 | (uint)!bVar7 * (int)fStack_454;
            auStack_160[uVar87 * 0x18 + 4] =
                 (uint)bVar8 * (int)fStack_1b0 | (uint)!bVar8 * (int)fStack_450;
            afStack_140[uVar87 * 0x18 + -3] =
                 (float)((uint)bVar9 * (int)fStack_1ac | (uint)!bVar9 * (int)fStack_44c);
            afStack_140[uVar87 * 0x18 + -2] =
                 (float)((uint)bVar10 * (int)fStack_1a8 | (uint)!bVar10 * (int)fStack_448);
            afStack_140[uVar87 * 0x18 + -1] =
                 (float)((uint)(bVar82 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar82 >> 7) * (int)fStack_444);
            uVar13 = vmovlps_avx(local_850);
            *(undefined8 *)(afStack_140 + uVar87 * 0x18) = uVar13;
            auStack_138[uVar87 * 0x18] = (int)local_838 + 1;
            local_830 = (ulong)((int)local_830 + 1);
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar254 = ZEXT3264(auVar105);
          }
        }
      }
    }
    auVar203 = ZEXT1664(local_850);
    local_830 = local_830 & 0xffffffff;
    do {
      if ((int)local_830 == 0) {
        uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar153;
        auVar37._0_4_ = uVar153;
        auVar37._8_4_ = uVar153;
        auVar37._12_4_ = uVar153;
        auVar37._16_4_ = uVar153;
        auVar37._20_4_ = uVar153;
        auVar37._24_4_ = uVar153;
        auVar37._28_4_ = uVar153;
        uVar13 = vcmpps_avx512vl(local_400,auVar37,2);
        uVar84 = (uint)local_828 & (uint)uVar13;
        local_828 = (ulong)uVar84;
        if (uVar84 == 0) {
          return;
        }
        goto LAB_01da9dc5;
      }
      uVar87 = (ulong)((int)local_830 - 1);
      auVar105 = *(undefined1 (*) [32])(auStack_160 + uVar87 * 0x18);
      auVar188._0_4_ = auVar105._0_4_ + (float)local_6a0._0_4_;
      auVar188._4_4_ = auVar105._4_4_ + (float)local_6a0._4_4_;
      auVar188._8_4_ = auVar105._8_4_ + fStack_698;
      auVar188._12_4_ = auVar105._12_4_ + fStack_694;
      auVar188._16_4_ = auVar105._16_4_ + fStack_690;
      auVar188._20_4_ = auVar105._20_4_ + fStack_68c;
      auVar188._24_4_ = auVar105._24_4_ + fStack_688;
      auVar188._28_4_ = auVar105._28_4_ + fStack_684;
      uVar153 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar36._4_4_ = uVar153;
      auVar36._0_4_ = uVar153;
      auVar36._8_4_ = uVar153;
      auVar36._12_4_ = uVar153;
      auVar36._16_4_ = uVar153;
      auVar36._20_4_ = uVar153;
      auVar36._24_4_ = uVar153;
      auVar36._28_4_ = uVar153;
      uVar13 = vcmpps_avx512vl(auVar188,auVar36,2);
      uVar88 = (uint)uVar13 & (uint)abStack_180[uVar87 * 0x60];
      bVar78 = (byte)uVar88;
      if (uVar88 != 0) {
        auVar189._8_4_ = 0x7f800000;
        auVar189._0_8_ = 0x7f8000007f800000;
        auVar189._12_4_ = 0x7f800000;
        auVar189._16_4_ = 0x7f800000;
        auVar189._20_4_ = 0x7f800000;
        auVar189._24_4_ = 0x7f800000;
        auVar189._28_4_ = 0x7f800000;
        auVar103 = vblendmps_avx512vl(auVar189,auVar105);
        auVar144._0_4_ =
             (uint)(bVar78 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)auVar105._0_4_;
        bVar6 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar6 * auVar103._4_4_ | (uint)!bVar6 * (int)auVar105._4_4_;
        bVar6 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar6 * auVar103._8_4_ | (uint)!bVar6 * (int)auVar105._8_4_;
        bVar6 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar6 * auVar103._12_4_ | (uint)!bVar6 * (int)auVar105._12_4_;
        bVar6 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar144._16_4_ = (uint)bVar6 * auVar103._16_4_ | (uint)!bVar6 * (int)auVar105._16_4_;
        bVar6 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar144._20_4_ = (uint)bVar6 * auVar103._20_4_ | (uint)!bVar6 * (int)auVar105._20_4_;
        bVar6 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar144._24_4_ = (uint)bVar6 * auVar103._24_4_ | (uint)!bVar6 * (int)auVar105._24_4_;
        auVar144._28_4_ =
             (uVar88 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar88 >> 7,0) * (int)auVar105._28_4_;
        auVar105 = vshufps_avx(auVar144,auVar144,0xb1);
        auVar105 = vminps_avx(auVar144,auVar105);
        auVar103 = vshufpd_avx(auVar105,auVar105,5);
        auVar105 = vminps_avx(auVar105,auVar103);
        auVar103 = vpermpd_avx2(auVar105,0x4e);
        auVar105 = vminps_avx(auVar105,auVar103);
        uVar13 = vcmpps_avx512vl(auVar144,auVar105,0);
        bVar82 = (byte)uVar13 & bVar78;
        if (bVar82 != 0) {
          uVar88 = (uint)bVar82;
        }
        fVar152 = afStack_140[uVar87 * 0x18 + 1];
        uVar145 = 0;
        for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
          uVar145 = uVar145 + 1;
        }
        local_838 = (ulong)auStack_138[uVar87 * 0x18];
        bVar82 = ~('\x01' << ((byte)uVar145 & 0x1f)) & bVar78;
        abStack_180[uVar87 * 0x60] = bVar82;
        uVar80 = uVar87;
        if (bVar82 != 0) {
          uVar80 = local_830;
        }
        fVar227 = afStack_140[uVar87 * 0x18];
        auVar190._4_4_ = fVar227;
        auVar190._0_4_ = fVar227;
        auVar190._8_4_ = fVar227;
        auVar190._12_4_ = fVar227;
        auVar190._16_4_ = fVar227;
        auVar190._20_4_ = fVar227;
        auVar190._24_4_ = fVar227;
        auVar190._28_4_ = fVar227;
        fVar152 = fVar152 - fVar227;
        auVar171._4_4_ = fVar152;
        auVar171._0_4_ = fVar152;
        auVar171._8_4_ = fVar152;
        auVar171._12_4_ = fVar152;
        auVar171._16_4_ = fVar152;
        auVar171._20_4_ = fVar152;
        auVar171._24_4_ = fVar152;
        auVar171._28_4_ = fVar152;
        auVar91 = vfmadd132ps_fma(auVar171,auVar190,_DAT_02020f20);
        _local_5e0 = ZEXT1632(auVar91);
        auVar203 = ZEXT864(*(ulong *)(local_5e0 + (ulong)uVar145 * 4));
        uVar87 = uVar80;
      }
      local_830 = uVar87;
    } while (bVar78 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }